

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  ulong uVar79;
  int iVar80;
  ulong uVar81;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint uVar82;
  long lVar83;
  byte bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar149;
  uint uVar150;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  uint uVar151;
  uint uVar155;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float pp;
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar174;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar175 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar224 [32];
  undefined1 auVar260 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar233;
  float fVar243;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar249 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  float fVar259;
  float fVar267;
  undefined1 auVar263 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar265;
  float fVar266;
  undefined1 auVar264 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  float s;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_ab0;
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 (*local_848) [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  Primitive *local_6d0;
  ulong local_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  RTCHitN local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar81 = (ulong)(byte)PVar1;
  fVar209 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar260 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar93 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  fVar208 = fVar209 * auVar93._0_4_;
  fVar156 = fVar209 * auVar260._0_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar81 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar81 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar16);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar81 * 6 + 6);
  auVar105 = vpmovsxbd_avx2(auVar88);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar106 = vpmovsxbd_avx2(auVar98);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar109 = vpmovsxbd_avx2(auVar97);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar109);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar81 + 6);
  auVar103 = vpmovsxbd_avx2(auVar89);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar79 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar108 = vpmovsxbd_avx2(auVar90);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 + uVar81 + 6);
  auVar110 = vpmovsxbd_avx2(auVar91);
  auVar110 = vcvtdq2ps_avx(auVar110);
  uVar85 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar101 = vpmovsxbd_avx2(auVar92);
  auVar111 = vcvtdq2ps_avx(auVar101);
  auVar121._4_4_ = fVar156;
  auVar121._0_4_ = fVar156;
  auVar121._8_4_ = fVar156;
  auVar121._12_4_ = fVar156;
  auVar121._16_4_ = fVar156;
  auVar121._20_4_ = fVar156;
  auVar121._24_4_ = fVar156;
  auVar121._28_4_ = fVar156;
  auVar123._8_4_ = 1;
  auVar123._0_8_ = 0x100000001;
  auVar123._12_4_ = 1;
  auVar123._16_4_ = 1;
  auVar123._20_4_ = 1;
  auVar123._24_4_ = 1;
  auVar123._28_4_ = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar113 = ZEXT1632(CONCAT412(fVar209 * auVar260._12_4_,
                                CONCAT48(fVar209 * auVar260._8_4_,
                                         CONCAT44(fVar209 * auVar260._4_4_,fVar156))));
  auVar112 = vpermps_avx2(auVar123,auVar113);
  auVar100 = vpermps_avx512vl(auVar99,auVar113);
  fVar156 = auVar100._0_4_;
  fVar227 = auVar100._4_4_;
  auVar113._4_4_ = fVar227 * auVar105._4_4_;
  auVar113._0_4_ = fVar156 * auVar105._0_4_;
  fVar228 = auVar100._8_4_;
  auVar113._8_4_ = fVar228 * auVar105._8_4_;
  fVar229 = auVar100._12_4_;
  auVar113._12_4_ = fVar229 * auVar105._12_4_;
  fVar230 = auVar100._16_4_;
  auVar113._16_4_ = fVar230 * auVar105._16_4_;
  fVar231 = auVar100._20_4_;
  auVar113._20_4_ = fVar231 * auVar105._20_4_;
  fVar232 = auVar100._24_4_;
  auVar113._24_4_ = fVar232 * auVar105._24_4_;
  auVar113._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar103._4_4_ * fVar227;
  auVar109._0_4_ = auVar103._0_4_ * fVar156;
  auVar109._8_4_ = auVar103._8_4_ * fVar228;
  auVar109._12_4_ = auVar103._12_4_ * fVar229;
  auVar109._16_4_ = auVar103._16_4_ * fVar230;
  auVar109._20_4_ = auVar103._20_4_ * fVar231;
  auVar109._24_4_ = auVar103._24_4_ * fVar232;
  auVar109._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar111._4_4_ * fVar227;
  auVar101._0_4_ = auVar111._0_4_ * fVar156;
  auVar101._8_4_ = auVar111._8_4_ * fVar228;
  auVar101._12_4_ = auVar111._12_4_ * fVar229;
  auVar101._16_4_ = auVar111._16_4_ * fVar230;
  auVar101._20_4_ = auVar111._20_4_ * fVar231;
  auVar101._24_4_ = auVar111._24_4_ * fVar232;
  auVar101._28_4_ = auVar100._28_4_;
  auVar15 = vfmadd231ps_fma(auVar113,auVar112,auVar102);
  auVar16 = vfmadd231ps_fma(auVar109,auVar112,auVar107);
  auVar88 = vfmadd231ps_fma(auVar101,auVar110,auVar112);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar121,auVar104);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,auVar106);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar108,auVar121);
  auVar122._4_4_ = fVar208;
  auVar122._0_4_ = fVar208;
  auVar122._8_4_ = fVar208;
  auVar122._12_4_ = fVar208;
  auVar122._16_4_ = fVar208;
  auVar122._20_4_ = fVar208;
  auVar122._24_4_ = fVar208;
  auVar122._28_4_ = fVar208;
  auVar101 = ZEXT1632(CONCAT412(fVar209 * auVar93._12_4_,
                                CONCAT48(fVar209 * auVar93._8_4_,
                                         CONCAT44(fVar209 * auVar93._4_4_,fVar208))));
  auVar109 = vpermps_avx2(auVar123,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  fVar209 = auVar101._0_4_;
  fVar156 = auVar101._4_4_;
  auVar112._4_4_ = fVar156 * auVar105._4_4_;
  auVar112._0_4_ = fVar209 * auVar105._0_4_;
  fVar227 = auVar101._8_4_;
  auVar112._8_4_ = fVar227 * auVar105._8_4_;
  fVar228 = auVar101._12_4_;
  auVar112._12_4_ = fVar228 * auVar105._12_4_;
  fVar229 = auVar101._16_4_;
  auVar112._16_4_ = fVar229 * auVar105._16_4_;
  fVar230 = auVar101._20_4_;
  auVar112._20_4_ = fVar230 * auVar105._20_4_;
  fVar231 = auVar101._24_4_;
  auVar112._24_4_ = fVar231 * auVar105._24_4_;
  auVar112._28_4_ = 1;
  auVar99._4_4_ = auVar103._4_4_ * fVar156;
  auVar99._0_4_ = auVar103._0_4_ * fVar209;
  auVar99._8_4_ = auVar103._8_4_ * fVar227;
  auVar99._12_4_ = auVar103._12_4_ * fVar228;
  auVar99._16_4_ = auVar103._16_4_ * fVar229;
  auVar99._20_4_ = auVar103._20_4_ * fVar230;
  auVar99._24_4_ = auVar103._24_4_ * fVar231;
  auVar99._28_4_ = auVar105._28_4_;
  auVar103._4_4_ = auVar111._4_4_ * fVar156;
  auVar103._0_4_ = auVar111._0_4_ * fVar209;
  auVar103._8_4_ = auVar111._8_4_ * fVar227;
  auVar103._12_4_ = auVar111._12_4_ * fVar228;
  auVar103._16_4_ = auVar111._16_4_ * fVar229;
  auVar103._20_4_ = auVar111._20_4_ * fVar230;
  auVar103._24_4_ = auVar111._24_4_ * fVar231;
  auVar103._28_4_ = auVar101._28_4_;
  auVar98 = vfmadd231ps_fma(auVar112,auVar109,auVar102);
  auVar97 = vfmadd231ps_fma(auVar99,auVar109,auVar107);
  auVar89 = vfmadd231ps_fma(auVar103,auVar109,auVar110);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar122,auVar104);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar122,auVar106);
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar122,auVar108);
  auVar104 = vandps_avx(ZEXT1632(auVar15),auVar118);
  auVar120._8_4_ = 0x219392ef;
  auVar120._0_8_ = 0x219392ef219392ef;
  auVar120._12_4_ = 0x219392ef;
  auVar120._16_4_ = 0x219392ef;
  auVar120._20_4_ = 0x219392ef;
  auVar120._24_4_ = 0x219392ef;
  auVar120._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar104,auVar120,1);
  bVar7 = (bool)((byte)uVar79 & 1);
  auVar100._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._0_4_;
  bVar7 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._4_4_;
  bVar7 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._8_4_;
  bVar7 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar16),auVar118);
  uVar79 = vcmpps_avx512vl(auVar104,auVar120,1);
  bVar7 = (bool)((byte)uVar79 & 1);
  auVar114._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._0_4_;
  bVar7 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._4_4_;
  bVar7 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._8_4_;
  bVar7 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar88),auVar118);
  uVar79 = vcmpps_avx512vl(auVar104,auVar120,1);
  bVar7 = (bool)((byte)uVar79 & 1);
  auVar104._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar88._0_4_;
  bVar7 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar88._4_4_;
  bVar7 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar88._8_4_;
  bVar7 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar88._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar119._8_4_ = 0x3f800000;
  auVar119._0_8_ = 0x3f8000003f800000;
  auVar119._12_4_ = 0x3f800000;
  auVar119._16_4_ = 0x3f800000;
  auVar119._20_4_ = 0x3f800000;
  auVar119._24_4_ = 0x3f800000;
  auVar119._28_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar100,auVar102,auVar119);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar114);
  auVar16 = vfnmadd213ps_fma(auVar114,auVar102,auVar119);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar88 = vfnmadd213ps_fma(auVar104,auVar102,auVar119);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar102,auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar98));
  auVar108._4_4_ = auVar15._4_4_ * auVar104._4_4_;
  auVar108._0_4_ = auVar15._0_4_ * auVar104._0_4_;
  auVar108._8_4_ = auVar15._8_4_ * auVar104._8_4_;
  auVar108._12_4_ = auVar15._12_4_ * auVar104._12_4_;
  auVar108._16_4_ = auVar104._16_4_ * 0.0;
  auVar108._20_4_ = auVar104._20_4_ * 0.0;
  auVar108._24_4_ = auVar104._24_4_ * 0.0;
  auVar108._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar98));
  auVar103 = vpbroadcastd_avx512vl();
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar117._0_4_ = auVar15._0_4_ * auVar104._0_4_;
  auVar117._4_4_ = auVar15._4_4_ * auVar104._4_4_;
  auVar117._8_4_ = auVar15._8_4_ * auVar104._8_4_;
  auVar117._12_4_ = auVar15._12_4_ * auVar104._12_4_;
  auVar117._16_4_ = auVar104._16_4_ * 0.0;
  auVar117._20_4_ = auVar104._20_4_ * 0.0;
  auVar117._24_4_ = auVar104._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar81 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar97));
  auVar110._4_4_ = auVar16._4_4_ * auVar104._4_4_;
  auVar110._0_4_ = auVar16._0_4_ * auVar104._0_4_;
  auVar110._8_4_ = auVar16._8_4_ * auVar104._8_4_;
  auVar110._12_4_ = auVar16._12_4_ * auVar104._12_4_;
  auVar110._16_4_ = auVar104._16_4_ * 0.0;
  auVar110._20_4_ = auVar104._20_4_ * 0.0;
  auVar110._24_4_ = auVar104._24_4_ * 0.0;
  auVar110._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar97));
  auVar116._0_4_ = auVar16._0_4_ * auVar104._0_4_;
  auVar116._4_4_ = auVar16._4_4_ * auVar104._4_4_;
  auVar116._8_4_ = auVar16._8_4_ * auVar104._8_4_;
  auVar116._12_4_ = auVar16._12_4_ * auVar104._12_4_;
  auVar116._16_4_ = auVar104._16_4_ * 0.0;
  auVar116._20_4_ = auVar104._20_4_ * 0.0;
  auVar116._24_4_ = auVar104._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar81 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar89));
  auVar111._4_4_ = auVar104._4_4_ * auVar88._4_4_;
  auVar111._0_4_ = auVar104._0_4_ * auVar88._0_4_;
  auVar111._8_4_ = auVar104._8_4_ * auVar88._8_4_;
  auVar111._12_4_ = auVar104._12_4_ * auVar88._12_4_;
  auVar111._16_4_ = auVar104._16_4_ * 0.0;
  auVar111._20_4_ = auVar104._20_4_ * 0.0;
  auVar111._24_4_ = auVar104._24_4_ * 0.0;
  auVar111._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar89));
  auVar115._0_4_ = auVar88._0_4_ * auVar104._0_4_;
  auVar115._4_4_ = auVar88._4_4_ * auVar104._4_4_;
  auVar115._8_4_ = auVar88._8_4_ * auVar104._8_4_;
  auVar115._12_4_ = auVar88._12_4_ * auVar104._12_4_;
  auVar115._16_4_ = auVar104._16_4_ * 0.0;
  auVar115._20_4_ = auVar104._20_4_ * 0.0;
  auVar115._24_4_ = auVar104._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar108,auVar117);
  auVar102 = vpminsd_avx2(auVar110,auVar116);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar111,auVar115);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar105._4_4_ = uVar174;
  auVar105._0_4_ = uVar174;
  auVar105._8_4_ = uVar174;
  auVar105._12_4_ = uVar174;
  auVar105._16_4_ = uVar174;
  auVar105._20_4_ = uVar174;
  auVar105._24_4_ = uVar174;
  auVar105._28_4_ = uVar174;
  auVar102 = vmaxps_avx512vl(auVar102,auVar105);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vpmaxsd_avx2(auVar108,auVar117);
  auVar102 = vpmaxsd_avx2(auVar110,auVar116);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar111,auVar115);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar106._4_4_ = uVar174;
  auVar106._0_4_ = uVar174;
  auVar106._8_4_ = uVar174;
  auVar106._12_4_ = uVar174;
  auVar106._16_4_ = uVar174;
  auVar106._20_4_ = uVar174;
  auVar106._24_4_ = uVar174;
  auVar106._28_4_ = uVar174;
  auVar102 = vminps_avx512vl(auVar102,auVar106);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar107);
  uVar18 = vpcmpgtd_avx512vl(auVar103,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_340,auVar104,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return;
  }
  local_6c8 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_848 = (undefined1 (*) [32])&local_400;
  local_560 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6d0 = prim;
LAB_01d142c9:
  lVar83 = 0;
  for (uVar79 = local_6c8; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  uVar82 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar83 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar83 = *(long *)&pGVar4[1].time_range.upper;
  auVar15 = *(undefined1 (*) [16])(lVar83 + (long)p_Var5 * uVar79);
  auVar16 = *(undefined1 (*) [16])(lVar83 + (uVar79 + 1) * (long)p_Var5);
  local_6c8 = local_6c8 - 1 & local_6c8;
  if (local_6c8 != 0) {
    uVar81 = local_6c8 - 1 & local_6c8;
    for (uVar85 = local_6c8; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    }
    if (uVar81 != 0) {
      for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar98 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar271._4_4_ = uVar174;
  auVar271._0_4_ = uVar174;
  auVar271._8_4_ = uVar174;
  auVar271._12_4_ = uVar174;
  local_5e0._16_4_ = uVar174;
  local_5e0._0_16_ = auVar271;
  local_5e0._20_4_ = uVar174;
  local_5e0._24_4_ = uVar174;
  local_5e0._28_4_ = uVar174;
  uVar174 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar96._4_4_ = uVar174;
  auVar96._0_4_ = uVar174;
  auVar96._8_4_ = uVar174;
  auVar96._12_4_ = uVar174;
  local_600._16_4_ = uVar174;
  local_600._0_16_ = auVar96;
  local_600._20_4_ = uVar174;
  local_600._24_4_ = uVar174;
  local_600._28_4_ = uVar174;
  auVar88 = vunpcklps_avx(auVar271,auVar96);
  fVar209 = *(float *)(ray + k * 4 + 0xc0);
  auVar274._4_4_ = fVar209;
  auVar274._0_4_ = fVar209;
  auVar274._8_4_ = fVar209;
  auVar274._12_4_ = fVar209;
  fStack_610 = fVar209;
  _local_620 = auVar274;
  fStack_60c = fVar209;
  fStack_608 = fVar209;
  register0x0000159c = fVar209;
  local_810 = vinsertps_avx(auVar88,auVar274,0x28);
  auVar93._0_4_ = auVar15._0_4_ + auVar16._0_4_;
  auVar93._4_4_ = auVar15._4_4_ + auVar16._4_4_;
  auVar93._8_4_ = auVar15._8_4_ + auVar16._8_4_;
  auVar93._12_4_ = auVar15._12_4_ + auVar16._12_4_;
  auVar260._8_4_ = 0x3f000000;
  auVar260._0_8_ = 0x3f0000003f000000;
  auVar260._12_4_ = 0x3f000000;
  auVar88 = vmulps_avx512vl(auVar93,auVar260);
  auVar88 = vsubps_avx(auVar88,auVar98);
  auVar88 = vdpps_avx(auVar88,local_810,0x7f);
  fVar156 = *(float *)(ray + k * 4 + 0x60);
  auVar268 = ZEXT464((uint)fVar156);
  local_820 = vdpps_avx(local_810,local_810,0x7f);
  auVar270 = ZEXT1664(local_820);
  auVar94._4_12_ = ZEXT812(0) << 0x20;
  auVar94._0_4_ = local_820._0_4_;
  auVar89 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar94);
  auVar97 = vfnmadd213ss_fma(auVar89,local_820,ZEXT416(0x40000000));
  local_320 = auVar88._0_4_ * auVar89._0_4_ * auVar97._0_4_;
  auVar95._4_4_ = local_320;
  auVar95._0_4_ = local_320;
  auVar95._8_4_ = local_320;
  auVar95._12_4_ = local_320;
  fStack_7f0 = local_320;
  _local_800 = auVar95;
  fStack_7ec = local_320;
  fStack_7e8 = local_320;
  fStack_7e4 = local_320;
  auVar88 = vfmadd231ps_fma(auVar98,local_810,auVar95);
  auVar88 = vblendps_avx(auVar88,ZEXT816(0) << 0x40,8);
  auVar15 = vsubps_avx(auVar15,auVar88);
  auVar98 = vsubps_avx(*(undefined1 (*) [16])(lVar83 + (uVar79 + 2) * (long)p_Var5),auVar88);
  auVar258 = ZEXT1664(auVar98);
  auVar16 = vsubps_avx(auVar16,auVar88);
  auVar264 = ZEXT1664(auVar16);
  auVar88 = vsubps_avx(*(undefined1 (*) [16])(lVar83 + (uVar79 + 3) * (long)p_Var5),auVar88);
  auVar104 = vbroadcastss_avx512vl(auVar15);
  auVar125._8_4_ = 1;
  auVar125._0_8_ = 0x100000001;
  auVar125._12_4_ = 1;
  auVar125._16_4_ = 1;
  auVar125._20_4_ = 1;
  auVar125._24_4_ = 1;
  auVar125._28_4_ = 1;
  local_780 = ZEXT1632(auVar15);
  local_8c0 = vpermps_avx512vl(auVar125,local_780);
  auVar276 = ZEXT3264(local_8c0);
  auVar126._8_4_ = 2;
  auVar126._0_8_ = 0x200000002;
  auVar126._12_4_ = 2;
  auVar126._16_4_ = 2;
  auVar126._20_4_ = 2;
  auVar126._24_4_ = 2;
  auVar126._28_4_ = 2;
  auVar102 = vpermps_avx512vl(auVar126,local_780);
  auVar127._8_4_ = 3;
  auVar127._0_8_ = 0x300000003;
  auVar127._12_4_ = 3;
  auVar127._16_4_ = 3;
  auVar127._20_4_ = 3;
  auVar127._24_4_ = 3;
  auVar127._28_4_ = 3;
  auVar105 = vpermps_avx512vl(auVar127,local_780);
  local_8e0 = vbroadcastss_avx512vl(auVar16);
  auVar277 = ZEXT3264(local_8e0);
  local_7c0 = ZEXT1632(auVar16);
  auVar106 = vpermps_avx512vl(auVar125,local_7c0);
  local_900 = vpermps_avx512vl(auVar126,local_7c0);
  auVar278 = ZEXT3264(local_900);
  auVar107 = vpermps_avx512vl(auVar127,local_7c0);
  auVar103 = vbroadcastss_avx512vl(auVar98);
  local_7a0 = ZEXT1632(auVar98);
  local_920 = vpermps_avx512vl(auVar125,local_7a0);
  auVar279 = ZEXT3264(local_920);
  local_280 = vpermps_avx512vl(auVar126,local_7a0);
  local_2a0 = vpermps_avx512vl(auVar127,local_7a0);
  local_260 = vbroadcastss_avx512vl(auVar88);
  _local_7e0 = ZEXT1632(auVar88);
  local_220 = vpermps_avx2(auVar125,_local_7e0);
  local_2e0 = vpermps_avx2(auVar126,_local_7e0);
  local_300 = vpermps_avx2(auVar127,_local_7e0);
  auVar15 = vfmadd231ps_fma(ZEXT432((uint)(fVar209 * fVar209)),local_600,local_600);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_5e0,local_5e0);
  local_240._0_4_ = auVar15._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar124._8_4_ = 0x7fffffff;
  auVar124._0_8_ = 0x7fffffff7fffffff;
  auVar124._12_4_ = 0x7fffffff;
  auVar124._16_4_ = 0x7fffffff;
  auVar124._20_4_ = 0x7fffffff;
  auVar124._24_4_ = 0x7fffffff;
  auVar124._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar124);
  local_710 = ZEXT416((uint)local_320);
  local_320 = fVar156 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_500 = vpbroadcastd_avx512vl();
  iVar80 = 1;
  uVar79 = 0;
  local_520 = vpbroadcastd_avx512vl();
  auVar15 = vsqrtss_avx(local_820,local_820);
  auVar16 = vsqrtss_avx(local_820,local_820);
  local_570 = ZEXT816(0x3f80000000000000);
  auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar280 = ZEXT3264(auVar108);
  local_2c0 = local_260;
  do {
    auVar88 = vmovshdup_avx(local_570);
    auVar88 = vsubps_avx(auVar88,local_570);
    auVar165._0_4_ = auVar88._0_4_;
    fVar208 = auVar165._0_4_ * 0.04761905;
    uVar174 = local_570._0_4_;
    auVar236._4_4_ = uVar174;
    auVar236._0_4_ = uVar174;
    auVar236._8_4_ = uVar174;
    auVar236._12_4_ = uVar174;
    auVar236._16_4_ = uVar174;
    auVar236._20_4_ = uVar174;
    auVar236._24_4_ = uVar174;
    auVar236._28_4_ = uVar174;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar88 = vfmadd231ps_fma(auVar236,auVar165,_DAT_01faff20);
    auVar108 = vsubps_avx512vl(auVar280._0_32_,ZEXT1632(auVar88));
    fVar233 = auVar88._0_4_;
    fVar241 = auVar88._4_4_;
    fVar242 = auVar88._8_4_;
    fVar243 = auVar88._12_4_;
    fVar245 = auVar108._0_4_;
    fVar246 = auVar108._4_4_;
    fVar250 = auVar108._8_4_;
    fVar251 = auVar108._12_4_;
    fVar252 = auVar108._16_4_;
    fVar253 = auVar108._20_4_;
    fVar254 = auVar108._24_4_;
    auVar135._4_4_ = fVar246 * fVar246 * -fVar241;
    auVar135._0_4_ = fVar245 * fVar245 * -fVar233;
    auVar135._8_4_ = fVar250 * fVar250 * -fVar242;
    auVar135._12_4_ = fVar251 * fVar251 * -fVar243;
    auVar135._16_4_ = fVar252 * fVar252 * -0.0;
    auVar135._20_4_ = fVar253 * fVar253 * -0.0;
    auVar135._24_4_ = fVar254 * fVar254 * -0.0;
    auVar135._28_4_ = 0x80000000;
    auVar258._0_28_ =
         ZEXT1628(CONCAT412(fVar243 * fVar243,
                            CONCAT48(fVar242 * fVar242,CONCAT44(fVar241 * fVar241,fVar233 * fVar233)
                                    )));
    fVar259 = fVar233 * 3.0;
    fVar265 = fVar241 * 3.0;
    fVar266 = fVar242 * 3.0;
    fVar267 = fVar243 * 3.0;
    auVar280._28_36_ = auVar264._28_36_;
    auVar280._0_28_ = ZEXT1628(CONCAT412(fVar267,CONCAT48(fVar266,CONCAT44(fVar265,fVar259))));
    auVar186._0_4_ = (fVar259 + -5.0) * fVar233 * fVar233;
    auVar186._4_4_ = (fVar265 + -5.0) * fVar241 * fVar241;
    auVar186._8_4_ = (fVar266 + -5.0) * fVar242 * fVar242;
    auVar186._12_4_ = (fVar267 + -5.0) * fVar243 * fVar243;
    auVar186._16_4_ = 0x80000000;
    auVar186._20_4_ = 0x80000000;
    auVar186._24_4_ = 0x80000000;
    auVar186._28_4_ = 0;
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar110 = vaddps_avx512vl(auVar186,auVar109);
    auVar269._0_4_ = fVar245 * fVar245;
    auVar269._4_4_ = fVar246 * fVar246;
    auVar269._8_4_ = fVar250 * fVar250;
    auVar269._12_4_ = fVar251 * fVar251;
    auVar269._16_4_ = fVar252 * fVar252;
    auVar269._20_4_ = fVar253 * fVar253;
    auVar269._28_36_ = auVar268._28_36_;
    auVar269._24_4_ = fVar254 * fVar254;
    auVar224._4_4_ = auVar269._4_4_ * (fVar246 * 3.0 + -5.0);
    auVar224._0_4_ = auVar269._0_4_ * (fVar245 * 3.0 + -5.0);
    auVar224._8_4_ = auVar269._8_4_ * (fVar250 * 3.0 + -5.0);
    auVar224._12_4_ = auVar269._12_4_ * (fVar251 * 3.0 + -5.0);
    auVar224._16_4_ = auVar269._16_4_ * (fVar252 * 3.0 + -5.0);
    auVar224._20_4_ = auVar269._20_4_ * (fVar253 * 3.0 + -5.0);
    auVar224._24_4_ = auVar269._24_4_ * (fVar254 * 3.0 + -5.0);
    auVar224._28_4_ = auVar270._28_4_ + -5.0;
    auVar111 = vaddps_avx512vl(auVar224,auVar109);
    fVar244 = auVar108._28_4_;
    auVar36._4_4_ = fVar241 * fVar241 * -fVar246;
    auVar36._0_4_ = fVar233 * fVar233 * -fVar245;
    auVar36._8_4_ = fVar242 * fVar242 * -fVar250;
    auVar36._12_4_ = fVar243 * fVar243 * -fVar251;
    auVar36._16_4_ = -fVar252 * 0.0 * 0.0;
    auVar36._20_4_ = -fVar253 * 0.0 * 0.0;
    auVar36._24_4_ = -fVar254 * 0.0 * 0.0;
    auVar36._28_4_ = -fVar244;
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar108 = vmulps_avx512vl(auVar135,auVar101);
    auVar112 = vmulps_avx512vl(auVar110,auVar101);
    auVar111 = vmulps_avx512vl(auVar111,auVar101);
    auVar113 = vmulps_avx512vl(auVar36,auVar101);
    auVar99 = vmulps_avx512vl(local_2c0,auVar113);
    fVar209 = auVar113._0_4_;
    fVar227 = auVar113._4_4_;
    auVar37._4_4_ = local_220._4_4_ * fVar227;
    auVar37._0_4_ = local_220._0_4_ * fVar209;
    fVar228 = auVar113._8_4_;
    auVar37._8_4_ = local_220._8_4_ * fVar228;
    fVar229 = auVar113._12_4_;
    auVar37._12_4_ = local_220._12_4_ * fVar229;
    fVar230 = auVar113._16_4_;
    auVar37._16_4_ = local_220._16_4_ * fVar230;
    fVar231 = auVar113._20_4_;
    auVar37._20_4_ = local_220._20_4_ * fVar231;
    fVar232 = auVar113._24_4_;
    auVar37._24_4_ = local_220._24_4_ * fVar232;
    auVar37._28_4_ = auVar110._28_4_;
    auVar38._4_4_ = local_2e0._4_4_ * fVar227;
    auVar38._0_4_ = local_2e0._0_4_ * fVar209;
    auVar38._8_4_ = local_2e0._8_4_ * fVar228;
    auVar38._12_4_ = local_2e0._12_4_ * fVar229;
    auVar38._16_4_ = local_2e0._16_4_ * fVar230;
    auVar38._20_4_ = local_2e0._20_4_ * fVar231;
    auVar38._24_4_ = local_2e0._24_4_ * fVar232;
    auVar38._28_4_ = local_220._28_4_;
    auVar39._4_4_ = local_300._4_4_ * fVar227;
    auVar39._0_4_ = local_300._0_4_ * fVar209;
    auVar39._8_4_ = local_300._8_4_ * fVar228;
    auVar39._12_4_ = local_300._12_4_ * fVar229;
    auVar39._16_4_ = local_300._16_4_ * fVar230;
    auVar39._20_4_ = local_300._20_4_ * fVar231;
    auVar39._24_4_ = local_300._24_4_ * fVar232;
    auVar39._28_4_ = auVar113._28_4_;
    auVar110 = vfmadd231ps_avx512vl(auVar99,auVar111,auVar103);
    auVar113 = vfmadd231ps_avx512vl(auVar37,auVar111,auVar279._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar38,auVar111,local_280);
    auVar111 = vfmadd231ps_avx512vl(auVar39,local_2a0,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar277._0_32_);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar106);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar278._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar112);
    auVar100 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar104);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,auVar276._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,auVar102);
    auVar114 = vfmadd231ps_avx512vl(auVar111,auVar105,auVar108);
    auVar40._4_4_ = (fVar246 + fVar246) * fVar241;
    auVar40._0_4_ = (fVar245 + fVar245) * fVar233;
    auVar40._8_4_ = (fVar250 + fVar250) * fVar242;
    auVar40._12_4_ = (fVar251 + fVar251) * fVar243;
    auVar40._16_4_ = (fVar252 + fVar252) * 0.0;
    auVar40._20_4_ = (fVar253 + fVar253) * 0.0;
    auVar40._24_4_ = (fVar254 + fVar254) * 0.0;
    auVar40._28_4_ = auVar112._28_4_;
    auVar108 = vsubps_avx(auVar40,auVar269._0_32_);
    auVar237._0_28_ =
         ZEXT1628(CONCAT412((fVar243 + fVar243) * (fVar267 + -5.0) + fVar267 * fVar243,
                            CONCAT48((fVar242 + fVar242) * (fVar266 + -5.0) + fVar266 * fVar242,
                                     CONCAT44((fVar241 + fVar241) * (fVar265 + -5.0) +
                                              fVar265 * fVar241,
                                              (fVar233 + fVar233) * (fVar259 + -5.0) +
                                              fVar259 * fVar233))));
    auVar237._28_4_ = auVar264._28_4_ + -5.0 + 0.0;
    auVar110 = vaddps_avx512vl(auVar280._0_32_,auVar109);
    auVar41._4_4_ = (fVar246 + fVar246) * auVar110._4_4_;
    auVar41._0_4_ = (fVar245 + fVar245) * auVar110._0_4_;
    auVar41._8_4_ = (fVar250 + fVar250) * auVar110._8_4_;
    auVar41._12_4_ = (fVar251 + fVar251) * auVar110._12_4_;
    auVar41._16_4_ = (fVar252 + fVar252) * auVar110._16_4_;
    auVar41._20_4_ = (fVar253 + fVar253) * auVar110._20_4_;
    auVar41._24_4_ = (fVar254 + fVar254) * auVar110._24_4_;
    auVar41._28_4_ = auVar110._28_4_;
    auVar42._4_4_ = fVar246 * 3.0 * fVar246;
    auVar42._0_4_ = fVar245 * 3.0 * fVar245;
    auVar42._8_4_ = fVar250 * 3.0 * fVar250;
    auVar42._12_4_ = fVar251 * 3.0 * fVar251;
    auVar42._16_4_ = fVar252 * 3.0 * fVar252;
    auVar42._20_4_ = fVar253 * 3.0 * fVar253;
    auVar42._24_4_ = fVar254 * 3.0 * fVar254;
    auVar42._28_4_ = fVar244;
    auVar110 = vsubps_avx(auVar41,auVar42);
    auVar111 = vsubps_avx(auVar258._0_32_,auVar40);
    auVar108 = vmulps_avx512vl(auVar108,auVar101);
    auVar115 = vmulps_avx512vl(auVar237,auVar101);
    auVar110 = vmulps_avx512vl(auVar110,auVar101);
    auVar111 = vmulps_avx512vl(auVar111,auVar101);
    auVar101 = vmulps_avx512vl(local_2c0,auVar111);
    auVar116 = vmulps_avx512vl(local_220,auVar111);
    auVar43._4_4_ = local_2e0._4_4_ * auVar111._4_4_;
    auVar43._0_4_ = local_2e0._0_4_ * auVar111._0_4_;
    auVar43._8_4_ = local_2e0._8_4_ * auVar111._8_4_;
    auVar43._12_4_ = local_2e0._12_4_ * auVar111._12_4_;
    auVar43._16_4_ = local_2e0._16_4_ * auVar111._16_4_;
    auVar43._20_4_ = local_2e0._20_4_ * auVar111._20_4_;
    auVar43._24_4_ = local_2e0._24_4_ * auVar111._24_4_;
    auVar43._28_4_ = auVar270._28_4_;
    auVar44._4_4_ = local_300._4_4_ * auVar111._4_4_;
    auVar44._0_4_ = local_300._0_4_ * auVar111._0_4_;
    auVar44._8_4_ = local_300._8_4_ * auVar111._8_4_;
    auVar44._12_4_ = local_300._12_4_ * auVar111._12_4_;
    auVar44._16_4_ = local_300._16_4_ * auVar111._16_4_;
    auVar44._20_4_ = local_300._20_4_ * auVar111._20_4_;
    auVar44._24_4_ = local_300._24_4_ * auVar111._24_4_;
    auVar44._28_4_ = auVar111._28_4_;
    auVar111 = vfmadd231ps_avx512vl(auVar101,auVar110,auVar103);
    auVar101 = vfmadd231ps_avx512vl(auVar116,auVar110,auVar279._0_32_);
    auVar116 = vfmadd231ps_avx512vl(auVar43,auVar110,local_280);
    auVar110 = vfmadd231ps_avx512vl(auVar44,local_2a0,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar277._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar115,auVar106);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar278._0_32_);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar115);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar104);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar276._0_32_);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar108,auVar102);
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar108);
    auVar45._4_4_ = auVar111._4_4_ * fVar208;
    auVar45._0_4_ = auVar111._0_4_ * fVar208;
    auVar45._8_4_ = auVar111._8_4_ * fVar208;
    auVar45._12_4_ = auVar111._12_4_ * fVar208;
    auVar45._16_4_ = auVar111._16_4_ * fVar208;
    auVar45._20_4_ = auVar111._20_4_ * fVar208;
    auVar45._24_4_ = auVar111._24_4_ * fVar208;
    auVar45._28_4_ = fVar244 + fVar244;
    auVar46._4_4_ = auVar101._4_4_ * fVar208;
    auVar46._0_4_ = auVar101._0_4_ * fVar208;
    auVar46._8_4_ = auVar101._8_4_ * fVar208;
    auVar46._12_4_ = auVar101._12_4_ * fVar208;
    auVar46._16_4_ = auVar101._16_4_ * fVar208;
    auVar46._20_4_ = auVar101._20_4_ * fVar208;
    auVar46._24_4_ = auVar101._24_4_ * fVar208;
    auVar46._28_4_ = auVar112._28_4_;
    auVar47._4_4_ = auVar115._4_4_ * fVar208;
    auVar47._0_4_ = auVar115._0_4_ * fVar208;
    auVar47._8_4_ = auVar115._8_4_ * fVar208;
    auVar47._12_4_ = auVar115._12_4_ * fVar208;
    auVar47._16_4_ = auVar115._16_4_ * fVar208;
    auVar47._20_4_ = auVar115._20_4_ * fVar208;
    auVar47._24_4_ = auVar115._24_4_ * fVar208;
    auVar47._28_4_ = 0;
    fVar209 = fVar208 * auVar108._0_4_;
    fVar227 = fVar208 * auVar108._4_4_;
    auVar48._4_4_ = fVar227;
    auVar48._0_4_ = fVar209;
    fVar228 = fVar208 * auVar108._8_4_;
    auVar48._8_4_ = fVar228;
    fVar229 = fVar208 * auVar108._12_4_;
    auVar48._12_4_ = fVar229;
    fVar230 = fVar208 * auVar108._16_4_;
    auVar48._16_4_ = fVar230;
    fVar231 = fVar208 * auVar108._20_4_;
    auVar48._20_4_ = fVar231;
    fVar232 = fVar208 * auVar108._24_4_;
    auVar48._24_4_ = fVar232;
    auVar48._28_4_ = fVar208;
    auVar88 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
    auVar112 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,ZEXT1632(auVar88));
    auVar115 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,ZEXT1632(auVar88));
    auVar268 = ZEXT3264(auVar115);
    auVar111 = ZEXT1632(auVar88);
    auVar116 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar111);
    auVar270 = ZEXT3264(auVar116);
    auVar238._0_4_ = auVar114._0_4_ + fVar209;
    auVar238._4_4_ = auVar114._4_4_ + fVar227;
    auVar238._8_4_ = auVar114._8_4_ + fVar228;
    auVar238._12_4_ = auVar114._12_4_ + fVar229;
    auVar238._16_4_ = auVar114._16_4_ + fVar230;
    auVar238._20_4_ = auVar114._20_4_ + fVar231;
    auVar238._24_4_ = auVar114._24_4_ + fVar232;
    auVar238._28_4_ = auVar114._28_4_ + fVar208;
    auVar108 = vmaxps_avx(auVar114,auVar238);
    auVar110 = vminps_avx(auVar114,auVar238);
    auVar114 = vpermt2ps_avx512vl(auVar114,_DAT_01feed00,auVar111);
    auVar117 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar111);
    auVar264 = ZEXT3264(auVar117);
    auVar118 = vpermt2ps_avx512vl(auVar46,_DAT_01feed00,auVar111);
    auVar135 = ZEXT1632(auVar88);
    auVar119 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar135);
    auVar111 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar135);
    auVar120 = vsubps_avx512vl(auVar114,auVar111);
    auVar111 = vsubps_avx(auVar112,auVar100);
    auVar258 = ZEXT3264(auVar111);
    auVar109 = vsubps_avx(auVar115,auVar113);
    auVar101 = vsubps_avx(auVar116,auVar99);
    auVar121 = vmulps_avx512vl(auVar109,auVar47);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar46,auVar101);
    auVar122 = vmulps_avx512vl(auVar101,auVar45);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar47,auVar111);
    auVar123 = vmulps_avx512vl(auVar111,auVar46);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar45,auVar109);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar122 = vmulps_avx512vl(auVar101,auVar101);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar109,auVar109);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar111,auVar111);
    auVar123 = vrcp14ps_avx512vl(auVar122);
    auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar280 = ZEXT3264(auVar124);
    auVar125 = vfnmadd213ps_avx512vl(auVar123,auVar122,auVar124);
    auVar123 = vfmadd132ps_avx512vl(auVar125,auVar123,auVar123);
    auVar121 = vmulps_avx512vl(auVar121,auVar123);
    auVar125 = vmulps_avx512vl(auVar109,auVar119);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar118,auVar101);
    auVar126 = vmulps_avx512vl(auVar101,auVar117);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar119,auVar111);
    auVar127 = vmulps_avx512vl(auVar111,auVar118);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar117,auVar109);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar123 = vmulps_avx512vl(auVar125,auVar123);
    auVar121 = vmaxps_avx512vl(auVar121,auVar123);
    auVar121 = vsqrtps_avx512vl(auVar121);
    auVar123 = vmaxps_avx512vl(auVar120,auVar114);
    auVar108 = vmaxps_avx512vl(auVar108,auVar123);
    auVar123 = vaddps_avx512vl(auVar121,auVar108);
    auVar108 = vminps_avx512vl(auVar120,auVar114);
    auVar108 = vminps_avx(auVar110,auVar108);
    auVar108 = vsubps_avx512vl(auVar108,auVar121);
    auVar128._8_4_ = 0x3f800002;
    auVar128._0_8_ = 0x3f8000023f800002;
    auVar128._12_4_ = 0x3f800002;
    auVar128._16_4_ = 0x3f800002;
    auVar128._20_4_ = 0x3f800002;
    auVar128._24_4_ = 0x3f800002;
    auVar128._28_4_ = 0x3f800002;
    auVar110 = vmulps_avx512vl(auVar123,auVar128);
    auVar129._8_4_ = 0x3f7ffffc;
    auVar129._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar129._12_4_ = 0x3f7ffffc;
    auVar129._16_4_ = 0x3f7ffffc;
    auVar129._20_4_ = 0x3f7ffffc;
    auVar129._24_4_ = 0x3f7ffffc;
    auVar129._28_4_ = 0x3f7ffffc;
    auVar108 = vmulps_avx512vl(auVar108,auVar129);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar114 = vrsqrt14ps_avx512vl(auVar122);
    auVar130._8_4_ = 0xbf000000;
    auVar130._0_8_ = 0xbf000000bf000000;
    auVar130._12_4_ = 0xbf000000;
    auVar130._16_4_ = 0xbf000000;
    auVar130._20_4_ = 0xbf000000;
    auVar130._24_4_ = 0xbf000000;
    auVar130._28_4_ = 0xbf000000;
    auVar120 = vmulps_avx512vl(auVar122,auVar130);
    fVar209 = auVar114._0_4_;
    fVar227 = auVar114._4_4_;
    fVar228 = auVar114._8_4_;
    fVar229 = auVar114._12_4_;
    fVar230 = auVar114._16_4_;
    fVar231 = auVar114._20_4_;
    fVar232 = auVar114._24_4_;
    auVar49._4_4_ = fVar227 * fVar227 * fVar227 * auVar120._4_4_;
    auVar49._0_4_ = fVar209 * fVar209 * fVar209 * auVar120._0_4_;
    auVar49._8_4_ = fVar228 * fVar228 * fVar228 * auVar120._8_4_;
    auVar49._12_4_ = fVar229 * fVar229 * fVar229 * auVar120._12_4_;
    auVar49._16_4_ = fVar230 * fVar230 * fVar230 * auVar120._16_4_;
    auVar49._20_4_ = fVar231 * fVar231 * fVar231 * auVar120._20_4_;
    auVar49._24_4_ = fVar232 * fVar232 * fVar232 * auVar120._24_4_;
    auVar49._28_4_ = auVar123._28_4_;
    auVar131._8_4_ = 0x3fc00000;
    auVar131._0_8_ = 0x3fc000003fc00000;
    auVar131._12_4_ = 0x3fc00000;
    auVar131._16_4_ = 0x3fc00000;
    auVar131._20_4_ = 0x3fc00000;
    auVar131._24_4_ = 0x3fc00000;
    auVar131._28_4_ = 0x3fc00000;
    auVar114 = vfmadd231ps_avx512vl(auVar49,auVar114,auVar131);
    auVar120 = vmulps_avx512vl(auVar111,auVar114);
    auVar121 = vmulps_avx512vl(auVar109,auVar114);
    auVar122 = vmulps_avx512vl(auVar101,auVar114);
    auVar123 = vsubps_avx512vl(auVar135,auVar100);
    auVar125 = vsubps_avx512vl(auVar135,auVar113);
    auVar126 = vsubps_avx512vl(auVar135,auVar99);
    auVar127 = vmulps_avx512vl(_local_620,auVar126);
    auVar127 = vfmadd231ps_avx512vl(auVar127,local_600,auVar125);
    auVar127 = vfmadd231ps_avx512vl(auVar127,local_5e0,auVar123);
    auVar128 = vmulps_avx512vl(auVar126,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,auVar125);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar123,auVar123);
    auVar129 = vmulps_avx512vl(_local_620,auVar122);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar121,local_600);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar120,local_5e0);
    auVar122 = vmulps_avx512vl(auVar126,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar125,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar123,auVar120);
    auVar121 = vmulps_avx512vl(auVar129,auVar129);
    auVar122 = vsubps_avx512vl(local_240,auVar121);
    auVar130 = vmulps_avx512vl(auVar129,auVar120);
    auVar127 = vsubps_avx512vl(auVar127,auVar130);
    auVar127 = vaddps_avx512vl(auVar127,auVar127);
    auVar130 = vmulps_avx512vl(auVar120,auVar120);
    local_760 = vsubps_avx512vl(auVar128,auVar130);
    auVar110 = vsubps_avx512vl(local_760,auVar110);
    local_880 = vmulps_avx512vl(auVar127,auVar127);
    auVar134._8_4_ = 0x40800000;
    auVar134._0_8_ = 0x4080000040800000;
    auVar134._12_4_ = 0x40800000;
    auVar134._16_4_ = 0x40800000;
    auVar134._20_4_ = 0x40800000;
    auVar134._24_4_ = 0x40800000;
    auVar134._28_4_ = 0x40800000;
    _local_640 = vmulps_avx512vl(auVar122,auVar134);
    auVar128 = vmulps_avx512vl(_local_640,auVar110);
    auVar128 = vsubps_avx512vl(local_880,auVar128);
    uVar85 = vcmpps_avx512vl(auVar128,auVar135,5);
    bVar74 = (byte)uVar85;
    fVar209 = (float)local_800._0_4_;
    fVar227 = (float)local_800._4_4_;
    fVar228 = fStack_7f8;
    fVar229 = fStack_7f4;
    fVar230 = fStack_7f0;
    fVar231 = fStack_7ec;
    fVar232 = fStack_7e8;
    fVar208 = fStack_7e4;
    if (bVar74 == 0) {
LAB_01d14ff9:
      auVar276 = ZEXT3264(local_8c0);
      auVar277 = ZEXT3264(local_8e0);
      auVar278 = ZEXT3264(local_900);
      auVar279 = ZEXT3264(local_920);
    }
    else {
      auVar128 = vsqrtps_avx512vl(auVar128);
      auVar130 = vaddps_avx512vl(auVar122,auVar122);
      local_660 = vrcp14ps_avx512vl(auVar130);
      auVar124 = vfnmadd213ps_avx512vl(local_660,auVar130,auVar124);
      auVar124 = vfmadd132ps_avx512vl(auVar124,local_660,local_660);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      local_680 = vxorps_avx512vl(auVar127,auVar29);
      auVar131 = vsubps_avx512vl(local_680,auVar128);
      auVar131 = vmulps_avx512vl(auVar131,auVar124);
      auVar128 = vsubps_avx512vl(auVar128,auVar127);
      local_8a0 = vmulps_avx512vl(auVar128,auVar124);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar128 = vblendmps_avx512vl(auVar124,auVar131);
      auVar132._0_4_ =
           (uint)(bVar74 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar124._0_4_;
      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar132._4_4_ = (uint)bVar7 * auVar128._4_4_ | (uint)!bVar7 * auVar124._4_4_;
      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar132._8_4_ = (uint)bVar7 * auVar128._8_4_ | (uint)!bVar7 * auVar124._8_4_;
      bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar132._12_4_ = (uint)bVar7 * auVar128._12_4_ | (uint)!bVar7 * auVar124._12_4_;
      bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar132._16_4_ = (uint)bVar7 * auVar128._16_4_ | (uint)!bVar7 * auVar124._16_4_;
      bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar132._20_4_ = (uint)bVar7 * auVar128._20_4_ | (uint)!bVar7 * auVar124._20_4_;
      bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar132._24_4_ = (uint)bVar7 * auVar128._24_4_ | (uint)!bVar7 * auVar124._24_4_;
      bVar7 = SUB81(uVar85 >> 7,0);
      auVar132._28_4_ = (uint)bVar7 * auVar128._28_4_ | (uint)!bVar7 * auVar124._28_4_;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar128 = vblendmps_avx512vl(auVar124,local_8a0);
      auVar133._0_4_ =
           (uint)(bVar74 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar124._0_4_;
      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar7 * auVar128._4_4_ | (uint)!bVar7 * auVar124._4_4_;
      bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar7 * auVar128._8_4_ | (uint)!bVar7 * auVar124._8_4_;
      bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar7 * auVar128._12_4_ | (uint)!bVar7 * auVar124._12_4_;
      bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar7 * auVar128._16_4_ | (uint)!bVar7 * auVar124._16_4_;
      bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar7 * auVar128._20_4_ | (uint)!bVar7 * auVar124._20_4_;
      bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar7 * auVar128._24_4_ | (uint)!bVar7 * auVar124._24_4_;
      bVar7 = SUB81(uVar85 >> 7,0);
      auVar133._28_4_ = (uint)bVar7 * auVar128._28_4_ | (uint)!bVar7 * auVar124._28_4_;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar121,auVar124);
      local_6a0 = vmaxps_avx512vl(local_260,auVar124);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_840 = vmulps_avx512vl(local_6a0,auVar30);
      vandps_avx512vl(auVar122,auVar124);
      uVar81 = vcmpps_avx512vl(local_840,local_840,1);
      uVar85 = uVar85 & uVar81;
      bVar77 = (byte)uVar85;
      if (bVar77 != 0) {
        uVar81 = vcmpps_avx512vl(auVar110,_DAT_01faff00,2);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar122 = vblendmps_avx512vl(auVar110,auVar121);
        bVar78 = (byte)uVar81;
        uVar87 = (uint)(bVar78 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar78 & 1) * local_840._0_4_;
        bVar7 = (bool)((byte)(uVar81 >> 1) & 1);
        uVar86 = (uint)bVar7 * auVar122._4_4_ | (uint)!bVar7 * local_840._4_4_;
        bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
        uVar149 = (uint)bVar7 * auVar122._8_4_ | (uint)!bVar7 * local_840._8_4_;
        bVar7 = (bool)((byte)(uVar81 >> 3) & 1);
        uVar150 = (uint)bVar7 * auVar122._12_4_ | (uint)!bVar7 * local_840._12_4_;
        bVar7 = (bool)((byte)(uVar81 >> 4) & 1);
        uVar151 = (uint)bVar7 * auVar122._16_4_ | (uint)!bVar7 * local_840._16_4_;
        bVar7 = (bool)((byte)(uVar81 >> 5) & 1);
        uVar152 = (uint)bVar7 * auVar122._20_4_ | (uint)!bVar7 * local_840._20_4_;
        bVar7 = (bool)((byte)(uVar81 >> 6) & 1);
        uVar153 = (uint)bVar7 * auVar122._24_4_ | (uint)!bVar7 * local_840._24_4_;
        bVar7 = SUB81(uVar81 >> 7,0);
        uVar154 = (uint)bVar7 * auVar122._28_4_ | (uint)!bVar7 * local_840._28_4_;
        auVar132._0_4_ = (bVar77 & 1) * uVar87 | !(bool)(bVar77 & 1) * auVar132._0_4_;
        bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar132._4_4_ = bVar7 * uVar86 | !bVar7 * auVar132._4_4_;
        bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar132._8_4_ = bVar7 * uVar149 | !bVar7 * auVar132._8_4_;
        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar132._12_4_ = bVar7 * uVar150 | !bVar7 * auVar132._12_4_;
        bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar132._16_4_ = bVar7 * uVar151 | !bVar7 * auVar132._16_4_;
        bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar132._20_4_ = bVar7 * uVar152 | !bVar7 * auVar132._20_4_;
        bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar132._24_4_ = bVar7 * uVar153 | !bVar7 * auVar132._24_4_;
        bVar7 = SUB81(uVar85 >> 7,0);
        auVar132._28_4_ = bVar7 * uVar154 | !bVar7 * auVar132._28_4_;
        auVar110 = vblendmps_avx512vl(auVar121,auVar110);
        bVar7 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar81 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar81 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
        bVar14 = SUB81(uVar81 >> 7,0);
        auVar133._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar78 & 1) * auVar110._0_4_ | !(bool)(bVar78 & 1) * uVar87) |
             !(bool)(bVar77 & 1) * auVar133._0_4_;
        bVar8 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar133._4_4_ =
             (uint)bVar8 * ((uint)bVar7 * auVar110._4_4_ | !bVar7 * uVar86) |
             !bVar8 * auVar133._4_4_;
        bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar133._8_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar110._8_4_ | !bVar9 * uVar149) |
             !bVar7 * auVar133._8_4_;
        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar133._12_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar110._12_4_ | !bVar10 * uVar150) |
             !bVar7 * auVar133._12_4_;
        bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar133._16_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar110._16_4_ | !bVar11 * uVar151) |
             !bVar7 * auVar133._16_4_;
        bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar133._20_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar110._20_4_ | !bVar12 * uVar152) |
             !bVar7 * auVar133._20_4_;
        bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar133._24_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar110._24_4_ | !bVar13 * uVar153) |
             !bVar7 * auVar133._24_4_;
        bVar7 = SUB81(uVar85 >> 7,0);
        auVar133._28_4_ =
             (uint)bVar7 * ((uint)bVar14 * auVar110._28_4_ | !bVar14 * uVar154) |
             !bVar7 * auVar133._28_4_;
        bVar74 = (~bVar77 | bVar78) & bVar74;
      }
      if ((bVar74 & 0x7f) == 0) {
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar280 = ZEXT3264(auVar108);
        goto LAB_01d14ff9;
      }
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar119 = vxorps_avx512vl(auVar119,auVar110);
      auVar117 = vxorps_avx512vl(auVar117,auVar110);
      uVar87 = *(uint *)(ray + k * 4 + 0x100);
      auVar118 = vxorps_avx512vl(auVar118,auVar110);
      auVar88 = vsubss_avx512f(ZEXT416(uVar87),ZEXT416((uint)local_710._0_4_));
      auVar121 = vbroadcastss_avx512vl(auVar88);
      auVar121 = vminps_avx512vl(auVar121,auVar133);
      auVar73._4_4_ = fStack_31c;
      auVar73._0_4_ = local_320;
      auVar73._8_4_ = fStack_318;
      auVar73._12_4_ = fStack_314;
      auVar73._16_4_ = fStack_310;
      auVar73._20_4_ = fStack_30c;
      auVar73._24_4_ = fStack_308;
      auVar73._28_4_ = fStack_304;
      auVar122 = vmaxps_avx512vl(auVar73,auVar132);
      auVar124 = vmulps_avx512vl(auVar126,auVar47);
      auVar124 = vfmadd213ps_avx512vl(auVar125,auVar46,auVar124);
      auVar88 = vfmadd213ps_fma(auVar123,auVar45,auVar124);
      auVar123 = vmulps_avx512vl(_local_620,auVar47);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_600,auVar46);
      auVar98 = vfmadd231ps_fma(auVar123,local_5e0,auVar45);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar98),auVar123);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar123,auVar124,1);
      auVar125 = vxorps_avx512vl(ZEXT1632(auVar88),auVar110);
      auVar126 = vrcp14ps_avx512vl(ZEXT1632(auVar98));
      auVar224 = ZEXT1632(auVar98);
      auVar128 = vxorps_avx512vl(auVar224,auVar110);
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar135 = vfnmadd213ps_avx512vl(auVar126,auVar224,auVar134);
      auVar88 = vfmadd132ps_fma(auVar135,auVar126,auVar126);
      fVar233 = auVar88._0_4_ * auVar125._0_4_;
      fVar241 = auVar88._4_4_ * auVar125._4_4_;
      auVar50._4_4_ = fVar241;
      auVar50._0_4_ = fVar233;
      fVar242 = auVar88._8_4_ * auVar125._8_4_;
      auVar50._8_4_ = fVar242;
      fVar243 = auVar88._12_4_ * auVar125._12_4_;
      auVar50._12_4_ = fVar243;
      fVar244 = auVar125._16_4_ * 0.0;
      auVar50._16_4_ = fVar244;
      fVar245 = auVar125._20_4_ * 0.0;
      auVar50._20_4_ = fVar245;
      fVar246 = auVar125._24_4_ * 0.0;
      auVar50._24_4_ = fVar246;
      auVar50._28_4_ = auVar125._28_4_;
      uVar18 = vcmpps_avx512vl(auVar224,auVar128,1);
      bVar77 = (byte)uVar17 | (byte)uVar18;
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar135 = vblendmps_avx512vl(auVar50,auVar275);
      auVar136._0_4_ =
           (uint)(bVar77 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar126._0_4_;
      bVar7 = (bool)(bVar77 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar7 * auVar135._4_4_ | (uint)!bVar7 * auVar126._4_4_;
      bVar7 = (bool)(bVar77 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar7 * auVar135._8_4_ | (uint)!bVar7 * auVar126._8_4_;
      bVar7 = (bool)(bVar77 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar7 * auVar135._12_4_ | (uint)!bVar7 * auVar126._12_4_;
      bVar7 = (bool)(bVar77 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar7 * auVar135._16_4_ | (uint)!bVar7 * auVar126._16_4_;
      bVar7 = (bool)(bVar77 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar7 * auVar135._20_4_ | (uint)!bVar7 * auVar126._20_4_;
      bVar7 = (bool)(bVar77 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar7 * auVar135._24_4_ | (uint)!bVar7 * auVar126._24_4_;
      auVar136._28_4_ =
           (uint)(bVar77 >> 7) * auVar135._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar126._28_4_;
      auVar122 = vmaxps_avx512vl(auVar122,auVar136);
      uVar18 = vcmpps_avx512vl(auVar224,auVar128,6);
      bVar77 = (byte)uVar17 | (byte)uVar18;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar137._0_4_ =
           (uint)(bVar77 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar233;
      bVar7 = (bool)(bVar77 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar77 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar77 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * (int)fVar243;
      bVar7 = (bool)(bVar77 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * (int)fVar244;
      bVar7 = (bool)(bVar77 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * (int)fVar245;
      bVar7 = (bool)(bVar77 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar7 * auVar126._24_4_ | (uint)!bVar7 * (int)fVar246;
      auVar137._28_4_ =
           (uint)(bVar77 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar125._28_4_;
      auVar125 = vminps_avx512vl(auVar121,auVar137);
      auVar88 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar88),auVar112);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar88),auVar115);
      auVar121 = ZEXT1632(auVar88);
      auVar116 = vsubps_avx512vl(auVar121,auVar116);
      auVar116 = vmulps_avx512vl(auVar116,auVar119);
      auVar115 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar115);
      auVar112 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar112);
      auVar115 = vmulps_avx512vl(_local_620,auVar119);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_600,auVar118);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_5e0,auVar117);
      vandps_avx512vl(auVar115,auVar123);
      uVar17 = vcmpps_avx512vl(auVar115,auVar124,1);
      auVar112 = vxorps_avx512vl(auVar112,auVar110);
      auVar116 = vrcp14ps_avx512vl(auVar115);
      auVar110 = vxorps_avx512vl(auVar115,auVar110);
      auVar270 = ZEXT3264(auVar110);
      auVar117 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar134);
      auVar88 = vfmadd132ps_fma(auVar117,auVar116,auVar116);
      fVar233 = auVar88._0_4_ * auVar112._0_4_;
      fVar241 = auVar88._4_4_ * auVar112._4_4_;
      auVar51._4_4_ = fVar241;
      auVar51._0_4_ = fVar233;
      fVar242 = auVar88._8_4_ * auVar112._8_4_;
      auVar51._8_4_ = fVar242;
      fVar243 = auVar88._12_4_ * auVar112._12_4_;
      auVar51._12_4_ = fVar243;
      fVar244 = auVar112._16_4_ * 0.0;
      auVar51._16_4_ = fVar244;
      fVar245 = auVar112._20_4_ * 0.0;
      auVar51._20_4_ = fVar245;
      fVar246 = auVar112._24_4_ * 0.0;
      auVar51._24_4_ = fVar246;
      auVar51._28_4_ = auVar112._28_4_;
      uVar18 = vcmpps_avx512vl(auVar115,auVar110,1);
      bVar77 = (byte)uVar17 | (byte)uVar18;
      auVar117 = vblendmps_avx512vl(auVar51,auVar275);
      auVar138._0_4_ =
           (uint)(bVar77 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar116._0_4_;
      bVar7 = (bool)(bVar77 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar7 * auVar117._4_4_ | (uint)!bVar7 * auVar116._4_4_;
      bVar7 = (bool)(bVar77 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar7 * auVar117._8_4_ | (uint)!bVar7 * auVar116._8_4_;
      bVar7 = (bool)(bVar77 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar7 * auVar117._12_4_ | (uint)!bVar7 * auVar116._12_4_;
      bVar7 = (bool)(bVar77 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar7 * auVar117._16_4_ | (uint)!bVar7 * auVar116._16_4_;
      bVar7 = (bool)(bVar77 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar7 * auVar117._20_4_ | (uint)!bVar7 * auVar116._20_4_;
      bVar7 = (bool)(bVar77 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar7 * auVar117._24_4_ | (uint)!bVar7 * auVar116._24_4_;
      auVar138._28_4_ =
           (uint)(bVar77 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar116._28_4_;
      auVar268 = ZEXT3264(auVar138);
      _local_6c0 = vmaxps_avx(auVar122,auVar138);
      auVar264 = ZEXT3264(_local_6c0);
      uVar18 = vcmpps_avx512vl(auVar115,auVar110,6);
      bVar77 = (byte)uVar17 | (byte)uVar18;
      auVar139._0_4_ =
           (uint)(bVar77 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar233;
      bVar7 = (bool)(bVar77 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar7 * auVar126._4_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar77 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar7 * auVar126._8_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar77 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar7 * auVar126._12_4_ | (uint)!bVar7 * (int)fVar243;
      bVar7 = (bool)(bVar77 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar7 * auVar126._16_4_ | (uint)!bVar7 * (int)fVar244;
      bVar7 = (bool)(bVar77 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar7 * auVar126._20_4_ | (uint)!bVar7 * (int)fVar245;
      bVar7 = (bool)(bVar77 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar7 * auVar126._24_4_ | (uint)!bVar7 * (int)fVar246;
      auVar139._28_4_ =
           (uint)(bVar77 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar112._28_4_;
      local_3a0 = vminps_avx(auVar125,auVar139);
      uVar17 = vcmpps_avx512vl(_local_6c0,local_3a0,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar17;
      if (bVar74 == 0) {
        auVar280 = ZEXT3264(auVar134);
        goto LAB_01d14ff9;
      }
      auVar110 = vmaxps_avx512vl(auVar121,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar131,auVar129,auVar120);
      auVar108 = vmulps_avx512vl(auVar114,auVar108);
      auVar112 = vfmadd213ps_avx512vl(local_8a0,auVar129,auVar120);
      auVar52._4_4_ = auVar114._4_4_ * auVar112._4_4_;
      auVar52._0_4_ = auVar114._0_4_ * auVar112._0_4_;
      auVar52._8_4_ = auVar114._8_4_ * auVar112._8_4_;
      auVar52._12_4_ = auVar114._12_4_ * auVar112._12_4_;
      auVar52._16_4_ = auVar114._16_4_ * auVar112._16_4_;
      auVar52._20_4_ = auVar114._20_4_ * auVar112._20_4_;
      auVar52._24_4_ = auVar114._24_4_ * auVar112._24_4_;
      auVar52._28_4_ = auVar138._28_4_;
      auVar108 = vminps_avx512vl(auVar108,auVar134);
      auVar59 = ZEXT812(0);
      auVar112 = ZEXT1232(auVar59) << 0x20;
      auVar108 = vmaxps_avx(auVar108,ZEXT1232(auVar59) << 0x20);
      auVar115 = vminps_avx512vl(auVar52,auVar134);
      auVar53._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar108._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar53,auVar165,auVar236);
      local_1a0 = ZEXT1632(auVar88);
      auVar108 = vmaxps_avx(auVar115,ZEXT1232(auVar59) << 0x20);
      auVar54._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar108._28_4_ + 7.0;
      auVar88 = vfmadd213ps_fma(auVar54,auVar165,auVar236);
      local_1c0 = ZEXT1632(auVar88);
      auVar55._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar55._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar55._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar55._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar55._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar55._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar55._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar55._28_4_ = auVar110._28_4_;
      auVar108 = vsubps_avx(local_760,auVar55);
      auVar56._4_4_ = auVar108._4_4_ * (float)local_640._4_4_;
      auVar56._0_4_ = auVar108._0_4_ * (float)local_640._0_4_;
      auVar56._8_4_ = auVar108._8_4_ * fStack_638;
      auVar56._12_4_ = auVar108._12_4_ * fStack_634;
      auVar56._16_4_ = auVar108._16_4_ * fStack_630;
      auVar56._20_4_ = auVar108._20_4_ * fStack_62c;
      auVar56._24_4_ = auVar108._24_4_ * fStack_628;
      auVar56._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(local_880,auVar56);
      uVar17 = vcmpps_avx512vl(auVar110,ZEXT1232(auVar59) << 0x20,5);
      bVar77 = (byte)uVar17;
      auVar278 = ZEXT3264(local_900);
      auVar279 = ZEXT3264(local_920);
      if (bVar77 == 0) {
        bVar77 = 0;
        auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar258 = ZEXT864(0) << 0x20;
        auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar268 = ZEXT864(0) << 0x20;
        auVar140._8_4_ = 0x7f800000;
        auVar140._0_8_ = 0x7f8000007f800000;
        auVar140._12_4_ = 0x7f800000;
        auVar140._16_4_ = 0x7f800000;
        auVar140._20_4_ = 0x7f800000;
        auVar140._24_4_ = 0x7f800000;
        auVar140._28_4_ = 0x7f800000;
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
      }
      else {
        uVar85 = vcmpps_avx512vl(auVar110,auVar121,5);
        auVar110 = vsqrtps_avx(auVar110);
        auVar112 = vfnmadd213ps_avx512vl(auVar130,local_660,auVar134);
        auVar116 = vfmadd132ps_avx512vl(auVar112,local_660,local_660);
        auVar112 = vsubps_avx(local_680,auVar110);
        auVar117 = vmulps_avx512vl(auVar112,auVar116);
        auVar110 = vsubps_avx512vl(auVar110,auVar127);
        auVar116 = vmulps_avx512vl(auVar110,auVar116);
        auVar110 = vfmadd213ps_avx512vl(auVar129,auVar117,auVar120);
        auVar57._4_4_ = auVar114._4_4_ * auVar110._4_4_;
        auVar57._0_4_ = auVar114._0_4_ * auVar110._0_4_;
        auVar57._8_4_ = auVar114._8_4_ * auVar110._8_4_;
        auVar57._12_4_ = auVar114._12_4_ * auVar110._12_4_;
        auVar57._16_4_ = auVar114._16_4_ * auVar110._16_4_;
        auVar57._20_4_ = auVar114._20_4_ * auVar110._20_4_;
        auVar57._24_4_ = auVar114._24_4_ * auVar110._24_4_;
        auVar57._28_4_ = auVar115._28_4_;
        auVar110 = vmulps_avx512vl(local_5e0,auVar117);
        auVar112 = vmulps_avx512vl(local_600,auVar117);
        auVar118 = vmulps_avx512vl(_local_620,auVar117);
        auVar115 = vfmadd213ps_avx512vl(auVar111,auVar57,auVar100);
        auVar110 = vsubps_avx512vl(auVar110,auVar115);
        auVar115 = vfmadd213ps_avx512vl(auVar109,auVar57,auVar113);
        auVar115 = vsubps_avx512vl(auVar112,auVar115);
        auVar88 = vfmadd213ps_fma(auVar57,auVar101,auVar99);
        auVar112 = vsubps_avx(auVar118,ZEXT1632(auVar88));
        auVar268 = ZEXT3264(auVar112);
        auVar112 = vfmadd213ps_avx512vl(auVar129,auVar116,auVar120);
        auVar114 = vmulps_avx512vl(auVar114,auVar112);
        auVar112 = vmulps_avx512vl(local_5e0,auVar116);
        auVar118 = vmulps_avx512vl(local_600,auVar116);
        auVar119 = vmulps_avx512vl(_local_620,auVar116);
        auVar88 = vfmadd213ps_fma(auVar111,auVar114,auVar100);
        auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar109,auVar114,auVar113);
        auVar111 = vsubps_avx512vl(auVar118,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar101,auVar114,auVar99);
        auVar109 = vsubps_avx512vl(auVar119,ZEXT1632(auVar88));
        auVar258 = ZEXT3264(auVar109);
        auVar166._8_4_ = 0x7f800000;
        auVar166._0_8_ = 0x7f8000007f800000;
        auVar166._12_4_ = 0x7f800000;
        auVar166._16_4_ = 0x7f800000;
        auVar166._20_4_ = 0x7f800000;
        auVar166._24_4_ = 0x7f800000;
        auVar166._28_4_ = 0x7f800000;
        auVar109 = vblendmps_avx512vl(auVar166,auVar117);
        bVar7 = (bool)((byte)uVar85 & 1);
        auVar140._0_4_ = (uint)bVar7 * auVar109._0_4_ | (uint)!bVar7 * auVar100._0_4_;
        bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * auVar100._4_4_;
        bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * auVar100._8_4_;
        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * auVar100._12_4_;
        bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * auVar100._16_4_;
        bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * auVar100._20_4_;
        bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * auVar100._24_4_;
        bVar7 = SUB81(uVar85 >> 7,0);
        auVar140._28_4_ = (uint)bVar7 * auVar109._28_4_ | (uint)!bVar7 * auVar100._28_4_;
        auVar167._8_4_ = 0xff800000;
        auVar167._0_8_ = 0xff800000ff800000;
        auVar167._12_4_ = 0xff800000;
        auVar167._16_4_ = 0xff800000;
        auVar167._20_4_ = 0xff800000;
        auVar167._24_4_ = 0xff800000;
        auVar167._28_4_ = 0xff800000;
        auVar109 = vblendmps_avx512vl(auVar167,auVar116);
        bVar7 = (bool)((byte)uVar85 & 1);
        auVar141._0_4_ = (uint)bVar7 * auVar109._0_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar141._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar141._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar141._24_4_ = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = SUB81(uVar85 >> 7,0);
        auVar141._28_4_ = (uint)bVar7 * auVar109._28_4_ | (uint)!bVar7 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar109 = vmulps_avx512vl(local_6a0,auVar31);
        uVar81 = vcmpps_avx512vl(auVar109,local_840,0xe);
        uVar85 = uVar85 & uVar81;
        bVar78 = (byte)uVar85;
        if (bVar78 != 0) {
          uVar81 = vcmpps_avx512vl(auVar108,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar263._8_4_ = 0xff800000;
          auVar263._0_8_ = 0xff800000ff800000;
          auVar263._12_4_ = 0xff800000;
          auVar263._16_4_ = 0xff800000;
          auVar263._20_4_ = 0xff800000;
          auVar263._24_4_ = 0xff800000;
          auVar263._28_4_ = 0xff800000;
          auVar108 = vblendmps_avx512vl(auVar257,auVar263);
          bVar84 = (byte)uVar81;
          uVar86 = (uint)(bVar84 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar109._0_4_;
          bVar7 = (bool)((byte)(uVar81 >> 1) & 1);
          uVar149 = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * auVar109._4_4_;
          bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
          uVar150 = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * auVar109._8_4_;
          bVar7 = (bool)((byte)(uVar81 >> 3) & 1);
          uVar151 = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * auVar109._12_4_;
          bVar7 = (bool)((byte)(uVar81 >> 4) & 1);
          uVar152 = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * auVar109._16_4_;
          bVar7 = (bool)((byte)(uVar81 >> 5) & 1);
          uVar153 = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * auVar109._20_4_;
          bVar7 = (bool)((byte)(uVar81 >> 6) & 1);
          uVar154 = (uint)bVar7 * auVar108._24_4_ | (uint)!bVar7 * auVar109._24_4_;
          bVar7 = SUB81(uVar81 >> 7,0);
          uVar155 = (uint)bVar7 * auVar108._28_4_ | (uint)!bVar7 * auVar109._28_4_;
          auVar140._0_4_ = (bVar78 & 1) * uVar86 | !(bool)(bVar78 & 1) * auVar140._0_4_;
          bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar140._4_4_ = bVar7 * uVar149 | !bVar7 * auVar140._4_4_;
          bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar140._8_4_ = bVar7 * uVar150 | !bVar7 * auVar140._8_4_;
          bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar140._12_4_ = bVar7 * uVar151 | !bVar7 * auVar140._12_4_;
          bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar140._16_4_ = bVar7 * uVar152 | !bVar7 * auVar140._16_4_;
          bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar140._20_4_ = bVar7 * uVar153 | !bVar7 * auVar140._20_4_;
          bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar140._24_4_ = bVar7 * uVar154 | !bVar7 * auVar140._24_4_;
          bVar7 = SUB81(uVar85 >> 7,0);
          auVar140._28_4_ = bVar7 * uVar155 | !bVar7 * auVar140._28_4_;
          auVar108 = vblendmps_avx512vl(auVar263,auVar257);
          bVar7 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar81 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar81 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
          bVar14 = SUB81(uVar81 >> 7,0);
          auVar141._0_4_ =
               (uint)(bVar78 & 1) *
               ((uint)(bVar84 & 1) * auVar108._0_4_ | !(bool)(bVar84 & 1) * uVar86) |
               !(bool)(bVar78 & 1) * auVar141._0_4_;
          bVar8 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar141._4_4_ =
               (uint)bVar8 * ((uint)bVar7 * auVar108._4_4_ | !bVar7 * uVar149) |
               !bVar8 * auVar141._4_4_;
          bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar141._8_4_ =
               (uint)bVar7 * ((uint)bVar9 * auVar108._8_4_ | !bVar9 * uVar150) |
               !bVar7 * auVar141._8_4_;
          bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar141._12_4_ =
               (uint)bVar7 * ((uint)bVar10 * auVar108._12_4_ | !bVar10 * uVar151) |
               !bVar7 * auVar141._12_4_;
          bVar7 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar141._16_4_ =
               (uint)bVar7 * ((uint)bVar11 * auVar108._16_4_ | !bVar11 * uVar152) |
               !bVar7 * auVar141._16_4_;
          bVar7 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar141._20_4_ =
               (uint)bVar7 * ((uint)bVar12 * auVar108._20_4_ | !bVar12 * uVar153) |
               !bVar7 * auVar141._20_4_;
          bVar7 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar141._24_4_ =
               (uint)bVar7 * ((uint)bVar13 * auVar108._24_4_ | !bVar13 * uVar154) |
               !bVar7 * auVar141._24_4_;
          bVar7 = SUB81(uVar85 >> 7,0);
          auVar141._28_4_ =
               (uint)bVar7 * ((uint)bVar14 * auVar108._28_4_ | !bVar14 * uVar155) |
               !bVar7 * auVar141._28_4_;
          bVar77 = (~bVar78 | bVar84) & bVar77;
        }
      }
      auVar270._0_4_ = (float)local_620._0_4_ * auVar258._0_4_;
      auVar270._4_4_ = (float)local_620._4_4_ * auVar258._4_4_;
      auVar270._8_4_ = fStack_618 * auVar258._8_4_;
      auVar270._12_4_ = fStack_614 * auVar258._12_4_;
      auVar270._16_4_ = fStack_610 * auVar258._16_4_;
      auVar270._20_4_ = fStack_60c * auVar258._20_4_;
      auVar270._28_36_ = auVar258._28_36_;
      auVar270._24_4_ = fStack_608 * auVar258._24_4_;
      auVar264 = ZEXT3264(local_600);
      auVar88 = vfmadd231ps_fma(auVar270._0_32_,local_600,auVar111);
      auVar258 = ZEXT3264(local_5e0);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_5e0,auVar112);
      auVar270 = ZEXT3264(_local_6c0);
      _local_200 = _local_6c0;
      local_1e0 = vminps_avx(local_3a0,auVar140);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(ZEXT1632(auVar88),auVar249);
      auVar111 = vmaxps_avx(_local_6c0,auVar141);
      local_3c0 = auVar111;
      auVar169._8_4_ = 0x3e99999a;
      auVar169._0_8_ = 0x3e99999a3e99999a;
      auVar169._12_4_ = 0x3e99999a;
      auVar169._16_4_ = 0x3e99999a;
      auVar169._20_4_ = 0x3e99999a;
      auVar169._24_4_ = 0x3e99999a;
      auVar169._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar108,auVar169,1);
      local_5c0._0_2_ = (short)uVar17;
      uVar17 = vcmpps_avx512vl(_local_6c0,local_1e0,2);
      bVar78 = (byte)uVar17 & bVar74;
      uVar18 = vcmpps_avx512vl(auVar111,local_3a0,2);
      auVar276 = ZEXT3264(local_8c0);
      auVar277 = ZEXT3264(local_8e0);
      if ((bVar74 & ((byte)uVar18 | (byte)uVar17)) == 0) {
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar280 = ZEXT3264(auVar108);
      }
      else {
        auVar58._4_4_ = (float)local_620._4_4_ * auVar268._4_4_;
        auVar58._0_4_ = (float)local_620._0_4_ * auVar268._0_4_;
        auVar58._8_4_ = fStack_618 * auVar268._8_4_;
        auVar58._12_4_ = fStack_614 * auVar268._12_4_;
        auVar58._16_4_ = fStack_610 * auVar268._16_4_;
        auVar58._20_4_ = fStack_60c * auVar268._20_4_;
        auVar58._24_4_ = fStack_608 * auVar268._24_4_;
        auVar58._28_4_ = 0x3e99999a;
        auVar88 = vfmadd213ps_fma(auVar115,local_600,auVar58);
        auVar88 = vfmadd213ps_fma(auVar110,local_5e0,ZEXT1632(auVar88));
        auVar108 = vandps_avx(ZEXT1632(auVar88),auVar249);
        uVar17 = vcmpps_avx512vl(auVar108,auVar169,1);
        bVar84 = (byte)uVar17 | ~bVar77;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar108 = vpblendmd_avx512vl(auVar170,auVar32);
        local_360._0_4_ = (uint)(bVar84 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
        bVar7 = (bool)(bVar84 >> 1 & 1);
        local_360._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar84 >> 2 & 1);
        local_360._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar84 >> 3 & 1);
        local_360._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar84 >> 4 & 1);
        local_360._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar84 >> 5 & 1);
        local_360._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar84 >> 6 & 1);
        local_360._24_4_ = (uint)bVar7 * auVar108._24_4_ | (uint)!bVar7 * 2;
        local_360._28_4_ = (uint)(bVar84 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar84 >> 7) * 2;
        local_540 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_540,local_360,5);
        bVar84 = (byte)uVar17 & bVar78;
        if (bVar84 == 0) {
          auVar172._4_4_ = uVar87;
          auVar172._0_4_ = uVar87;
          auVar172._8_4_ = uVar87;
          auVar172._12_4_ = uVar87;
          auVar172._16_4_ = uVar87;
          auVar172._20_4_ = uVar87;
          auVar172._24_4_ = uVar87;
          auVar172._28_4_ = uVar87;
        }
        else {
          local_380 = auVar111;
          auVar98 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar88 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar97 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar89 = vminps_avx(auVar98,auVar97);
          auVar98 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar97 = vmaxps_avx(auVar88,auVar98);
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar89,auVar191);
          auVar98 = vandps_avx(auVar97,auVar191);
          auVar88 = vmaxps_avx(auVar88,auVar98);
          auVar98 = vmovshdup_avx(auVar88);
          auVar98 = vmaxss_avx(auVar98,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar98);
          fVar209 = auVar88._0_4_ * 1.9073486e-06;
          local_700 = vshufps_avx(auVar97,auVar97,0xff);
          local_5a0 = (float)local_6c0._0_4_ + (float)local_800._0_4_;
          fStack_59c = (float)local_6c0._4_4_ + (float)local_800._4_4_;
          fStack_598 = fStack_6b8 + fStack_7f8;
          fStack_594 = fStack_6b4 + fStack_7f4;
          fStack_590 = fStack_6b0 + fStack_7f0;
          fStack_58c = fStack_6ac + fStack_7ec;
          fStack_588 = fStack_6a8 + fStack_7e8;
          fStack_584 = fStack_6a4 + fStack_7e4;
          do {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar108 = vblendmps_avx512vl(auVar171,_local_6c0);
            auVar143._0_4_ =
                 (uint)(bVar84 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar84 >> 1 & 1);
            auVar143._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar84 >> 2 & 1);
            auVar143._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar84 >> 3 & 1);
            auVar143._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar84 >> 4 & 1);
            auVar143._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar84 >> 5 & 1);
            auVar143._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar143._24_4_ =
                 (uint)(bVar84 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar108 = vshufps_avx(auVar143,auVar143,0xb1);
            auVar108 = vminps_avx(auVar143,auVar108);
            auVar110 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar110);
            auVar110 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar110);
            uVar17 = vcmpps_avx512vl(auVar143,auVar108,0);
            bVar75 = (byte)uVar17 & bVar84;
            bVar76 = bVar84;
            if (bVar75 != 0) {
              bVar76 = bVar75;
            }
            iVar20 = 0;
            for (uVar87 = (uint)bVar76; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar87 = *(uint *)(local_1a0 + (uint)(iVar20 << 2));
            uVar86 = *(uint *)(local_200 + (uint)(iVar20 << 2));
            fVar227 = auVar16._0_4_;
            if ((float)local_820._0_4_ < 0.0) {
              fVar227 = sqrtf((float)local_820._0_4_);
            }
            auVar88 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar87),0x10);
            lVar83 = 5;
            do {
              uVar174 = auVar88._0_4_;
              auVar157._4_4_ = uVar174;
              auVar157._0_4_ = uVar174;
              auVar157._8_4_ = uVar174;
              auVar157._12_4_ = uVar174;
              auVar98 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_810);
              auVar97 = vmovshdup_avx(auVar88);
              fVar233 = auVar97._0_4_;
              fVar208 = 1.0 - fVar233;
              fVar228 = fVar233 * fVar233;
              auVar260 = SUB6416(ZEXT464(0x40400000),0);
              auVar92 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar90 = vfmadd213ss_fma(auVar260,auVar97,auVar92);
              auVar89 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar228),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar91 = vfmadd213ss_fma(auVar260,ZEXT416((uint)fVar208),auVar92);
              auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar208 * fVar208)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar229 = fVar208 * fVar208 * -fVar233 * 0.5;
              fVar230 = auVar89._0_4_ * 0.5;
              fVar231 = auVar91._0_4_ * 0.5;
              fVar232 = fVar233 * fVar233 * -fVar208 * 0.5;
              auVar210._0_4_ = fVar232 * (float)local_7e0._0_4_;
              auVar210._4_4_ = fVar232 * (float)local_7e0._4_4_;
              auVar210._8_4_ = fVar232 * fStack_7d8;
              auVar210._12_4_ = fVar232 * fStack_7d4;
              auVar234._4_4_ = fVar231;
              auVar234._0_4_ = fVar231;
              auVar234._8_4_ = fVar231;
              auVar234._12_4_ = fVar231;
              auVar89 = vfmadd132ps_fma(auVar234,auVar210,local_7a0._0_16_);
              auVar192._4_4_ = fVar230;
              auVar192._0_4_ = fVar230;
              auVar192._8_4_ = fVar230;
              auVar192._12_4_ = fVar230;
              auVar89 = vfmadd132ps_fma(auVar192,auVar89,local_7c0._0_16_);
              auVar211._4_4_ = fVar229;
              auVar211._0_4_ = fVar229;
              auVar211._8_4_ = fVar229;
              auVar211._12_4_ = fVar229;
              auVar89 = vfmadd132ps_fma(auVar211,auVar89,local_780._0_16_);
              auVar91 = vfmadd231ss_fma(auVar92,auVar97,ZEXT416(0x41100000));
              local_660._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar97,ZEXT416(0x40800000));
              local_680._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(auVar260,auVar97,ZEXT416(0xbf800000));
              local_6a0._0_16_ = auVar91;
              _local_640 = auVar89;
              auVar89 = vsubps_avx(auVar98,auVar89);
              auVar98 = vdpps_avx(auVar89,auVar89,0x7f);
              fVar229 = auVar98._0_4_;
              local_760 = ZEXT1632(auVar88);
              if (fVar229 < 0.0) {
                local_880._0_4_ = auVar90._0_4_;
                local_8a0._0_16_ = ZEXT416((uint)fVar208);
                local_840._0_4_ = fVar228;
                auVar264._0_4_ = sqrtf(fVar229);
                auVar264._4_60_ = extraout_var;
                auVar90 = ZEXT416((uint)local_880._0_4_);
                auVar88 = auVar264._0_16_;
                auVar91 = local_8a0._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar98,auVar98);
                local_840._0_4_ = fVar228;
                auVar91 = ZEXT416((uint)fVar208);
              }
              fVar228 = auVar91._0_4_;
              auVar260 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar228 + fVar228))),auVar91,
                                          auVar91);
              auVar90 = vfmadd213ss_fma(auVar90,ZEXT416((uint)(fVar233 + fVar233)),
                                        ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar97,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * fVar228 * -3.0)),
                                        ZEXT416((uint)(fVar228 + fVar228)),auVar91);
              auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 * -2.0)),auVar97,
                                        ZEXT416((uint)local_840._0_4_));
              fVar228 = auVar260._0_4_ * 0.5;
              fVar230 = auVar90._0_4_ * 0.5;
              fVar231 = auVar92._0_4_ * 0.5;
              fVar232 = auVar91._0_4_ * 0.5;
              auVar212._0_4_ = fVar232 * (float)local_7e0._0_4_;
              auVar212._4_4_ = fVar232 * (float)local_7e0._4_4_;
              auVar212._8_4_ = fVar232 * fStack_7d8;
              auVar212._12_4_ = fVar232 * fStack_7d4;
              auVar193._4_4_ = fVar231;
              auVar193._0_4_ = fVar231;
              auVar193._8_4_ = fVar231;
              auVar193._12_4_ = fVar231;
              auVar90 = vfmadd132ps_fma(auVar193,auVar212,local_7a0._0_16_);
              auVar176._4_4_ = fVar230;
              auVar176._0_4_ = fVar230;
              auVar176._8_4_ = fVar230;
              auVar176._12_4_ = fVar230;
              auVar90 = vfmadd132ps_fma(auVar176,auVar90,local_7c0._0_16_);
              auVar272._4_4_ = fVar228;
              auVar272._0_4_ = fVar228;
              auVar272._8_4_ = fVar228;
              auVar272._12_4_ = fVar228;
              local_880._0_16_ = vfmadd132ps_fma(auVar272,auVar90,local_780._0_16_);
              local_840._0_16_ = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
              auVar60._12_4_ = 0;
              auVar60._0_12_ = ZEXT812(0);
              fVar228 = local_840._0_4_;
              auVar90 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar228));
              fVar230 = auVar90._0_4_;
              auVar91 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar228));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(local_840._0_16_,auVar21);
              auVar90 = vfnmadd213ss_fma(auVar91,local_840._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_8a0._0_4_ = auVar88._0_4_;
              if (fVar228 < auVar92._0_4_) {
                fVar231 = sqrtf(fVar228);
                auVar88 = ZEXT416((uint)local_8a0._0_4_);
                auVar92 = local_880._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(local_840._0_16_,local_840._0_16_);
                fVar231 = auVar92._0_4_;
                auVar92 = local_880._0_16_;
              }
              fVar228 = fVar230 * 1.5 + fVar228 * -0.5 * fVar230 * fVar230 * fVar230;
              auVar158._0_4_ = auVar92._0_4_ * fVar228;
              auVar158._4_4_ = auVar92._4_4_ * fVar228;
              auVar158._8_4_ = auVar92._8_4_ * fVar228;
              auVar158._12_4_ = auVar92._12_4_ * fVar228;
              auVar260 = vdpps_avx(auVar89,auVar158,0x7f);
              fVar208 = auVar88._0_4_;
              fVar230 = auVar260._0_4_;
              auVar159._0_4_ = fVar230 * fVar230;
              auVar159._4_4_ = auVar260._4_4_ * auVar260._4_4_;
              auVar159._8_4_ = auVar260._8_4_ * auVar260._8_4_;
              auVar159._12_4_ = auVar260._12_4_ * auVar260._12_4_;
              auVar93 = vsubps_avx512vl(auVar98,auVar159);
              fVar232 = auVar93._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar232;
              auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar95 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
              if (fVar232 < 0.0) {
                local_6f0 = fVar228;
                fStack_6ec = fVar228;
                fStack_6e8 = fVar228;
                fStack_6e4 = fVar228;
                local_6e0 = auVar94;
                fVar232 = sqrtf(fVar232);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar88 = ZEXT416((uint)local_8a0._0_4_);
                auVar93 = local_6e0;
                auVar92 = local_880._0_16_;
                fVar228 = local_6f0;
                fVar233 = fStack_6ec;
                fVar241 = fStack_6e8;
                fVar242 = fStack_6e4;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                fVar232 = auVar93._0_4_;
                auVar93 = auVar94;
                fVar233 = fVar228;
                fVar241 = fVar228;
                fVar242 = fVar228;
              }
              auVar268 = ZEXT1664(auVar89);
              auVar276 = ZEXT3264(local_8c0);
              auVar277 = ZEXT3264(local_8e0);
              auVar278 = ZEXT3264(local_900);
              auVar279 = ZEXT3264(local_920);
              auVar178._0_4_ = (float)local_6a0._0_4_ * (float)local_7e0._0_4_;
              auVar178._4_4_ = (float)local_6a0._0_4_ * (float)local_7e0._4_4_;
              auVar178._8_4_ = (float)local_6a0._0_4_ * fStack_7d8;
              auVar178._12_4_ = (float)local_6a0._0_4_ * fStack_7d4;
              auVar194._4_4_ = local_680._0_4_;
              auVar194._0_4_ = local_680._0_4_;
              auVar194._8_4_ = local_680._0_4_;
              auVar194._12_4_ = local_680._0_4_;
              auVar271 = vfmadd132ps_fma(auVar194,auVar178,local_7a0._0_16_);
              auVar179._4_4_ = local_660._0_4_;
              auVar179._0_4_ = local_660._0_4_;
              auVar179._8_4_ = local_660._0_4_;
              auVar179._12_4_ = local_660._0_4_;
              auVar271 = vfmadd132ps_fma(auVar179,auVar271,local_7c0._0_16_);
              auVar97 = vfmadd213ss_fma(auVar97,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar174 = auVar97._0_4_;
              auVar195._4_4_ = uVar174;
              auVar195._0_4_ = uVar174;
              auVar195._8_4_ = uVar174;
              auVar195._12_4_ = uVar174;
              auVar97 = vfmadd132ps_fma(auVar195,auVar271,local_780._0_16_);
              auVar180._0_4_ = auVar97._0_4_ * (float)local_840._0_4_;
              auVar180._4_4_ = auVar97._4_4_ * (float)local_840._0_4_;
              auVar180._8_4_ = auVar97._8_4_ * (float)local_840._0_4_;
              auVar180._12_4_ = auVar97._12_4_ * (float)local_840._0_4_;
              auVar97 = vdpps_avx(auVar92,auVar97,0x7f);
              fVar243 = auVar97._0_4_;
              auVar196._0_4_ = auVar92._0_4_ * fVar243;
              auVar196._4_4_ = auVar92._4_4_ * fVar243;
              auVar196._8_4_ = auVar92._8_4_ * fVar243;
              auVar196._12_4_ = auVar92._12_4_ * fVar243;
              auVar97 = vsubps_avx(auVar180,auVar196);
              local_ab0 = auVar91._0_4_;
              local_ab0 = auVar90._0_4_ * local_ab0;
              auVar91 = vmaxss_avx(ZEXT416((uint)fVar209),
                                   ZEXT416((uint)(local_760._0_4_ * fVar227 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar144._16_16_ = local_920._16_16_;
              auVar96 = vxorps_avx512vl(auVar92,auVar22);
              auVar197._0_4_ = fVar228 * auVar97._0_4_ * local_ab0;
              auVar197._4_4_ = fVar233 * auVar97._4_4_ * local_ab0;
              auVar197._8_4_ = fVar241 * auVar97._8_4_ * local_ab0;
              auVar197._12_4_ = fVar242 * auVar97._12_4_ * local_ab0;
              auVar270 = ZEXT1664(auVar158);
              auVar97 = vdpps_avx(auVar96,auVar158,0x7f);
              auVar90 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar209),auVar91);
              auVar88 = vdpps_avx(auVar89,auVar197,0x7f);
              auVar271 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 + 1.0)),
                                         ZEXT416((uint)(fVar209 / fVar231)),auVar90);
              fVar228 = auVar97._0_4_ + auVar88._0_4_;
              auVar88 = vdpps_avx(local_810,auVar158,0x7f);
              auVar97 = vdpps_avx(auVar89,auVar96,0x7f);
              auVar90 = vmulss_avx512f(auVar95,auVar93);
              fVar231 = auVar94._0_4_ * 1.5 + auVar90._0_4_ * auVar93._0_4_ * auVar93._0_4_;
              auVar90 = vdpps_avx(auVar89,local_810,0x7f);
              auVar94 = vfnmadd231ss_fma(auVar97,auVar260,ZEXT416((uint)fVar228));
              auVar90 = vfnmadd231ss_fma(auVar90,auVar260,auVar88);
              auVar97 = vpermilps_avx(_local_640,0xff);
              fVar232 = fVar232 - auVar97._0_4_;
              auVar93 = vshufps_avx(auVar92,auVar92,0xff);
              auVar97 = vfmsub213ss_fma(auVar94,ZEXT416((uint)fVar231),auVar93);
              auVar261._8_4_ = 0x80000000;
              auVar261._0_8_ = 0x8000000080000000;
              auVar261._12_4_ = 0x80000000;
              auVar264 = ZEXT1664(auVar261);
              auVar255._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar258 = ZEXT1664(auVar255);
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * fVar231));
              auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar97._0_4_)),
                                        ZEXT416((uint)fVar228),auVar90);
              auVar97 = vinsertps_avx(auVar255,auVar90,0x1c);
              auVar247._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar247._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar247._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar228),auVar247,0x10);
              auVar213._0_4_ = auVar94._0_4_;
              auVar213._4_4_ = auVar213._0_4_;
              auVar213._8_4_ = auVar213._0_4_;
              auVar213._12_4_ = auVar213._0_4_;
              auVar88 = vdivps_avx(auVar97,auVar213);
              auVar97 = vdivps_avx(auVar90,auVar213);
              auVar214._0_4_ = fVar230 * auVar88._0_4_ + fVar232 * auVar97._0_4_;
              auVar214._4_4_ = fVar230 * auVar88._4_4_ + fVar232 * auVar97._4_4_;
              auVar214._8_4_ = fVar230 * auVar88._8_4_ + fVar232 * auVar97._8_4_;
              auVar214._12_4_ = fVar230 * auVar88._12_4_ + fVar232 * auVar97._12_4_;
              auVar88 = vsubps_avx(local_760._0_16_,auVar214);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar97 = vandps_avx512vl(auVar260,auVar23);
              if (auVar97._0_4_ < auVar271._0_4_) {
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar271._0_4_ + auVar91._0_4_)),local_700,
                                          ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar24);
                if (auVar90._0_4_ < auVar97._0_4_) {
                  fVar227 = auVar88._0_4_ + (float)local_710._0_4_;
                  if ((fVar227 < fVar156) ||
                     (fVar228 = *(float *)(ray + k * 4 + 0x100), fVar228 < fVar227)) break;
                  auVar97 = vmovshdup_avx(auVar88);
                  fVar230 = auVar97._0_4_;
                  if ((fVar230 < 0.0) || (1.0 < fVar230)) break;
                  auVar61._12_4_ = 0;
                  auVar61._0_12_ = ZEXT412(0);
                  auVar144._4_12_ = ZEXT412(0);
                  auVar144._0_4_ = fVar229;
                  auVar97 = vrsqrt14ss_avx512f(auVar61 << 0x20,auVar144._0_16_);
                  fVar229 = auVar97._0_4_;
                  auVar98 = vmulss_avx512f(auVar98,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar229 = fVar229 * 1.5 + auVar98._0_4_ * fVar229 * fVar229 * fVar229;
                  auVar215._0_4_ = auVar89._0_4_ * fVar229;
                  auVar215._4_4_ = auVar89._4_4_ * fVar229;
                  auVar215._8_4_ = auVar89._8_4_ * fVar229;
                  auVar215._12_4_ = auVar89._12_4_ * fVar229;
                  auVar91 = vfmadd213ps_fma(auVar93,auVar215,auVar92);
                  auVar98 = vshufps_avx(auVar215,auVar215,0xc9);
                  auVar97 = vshufps_avx(auVar92,auVar92,0xc9);
                  auVar216._0_4_ = auVar215._0_4_ * auVar97._0_4_;
                  auVar216._4_4_ = auVar215._4_4_ * auVar97._4_4_;
                  auVar216._8_4_ = auVar215._8_4_ * auVar97._8_4_;
                  auVar216._12_4_ = auVar215._12_4_ * auVar97._12_4_;
                  auVar90 = vfmsub231ps_fma(auVar216,auVar92,auVar98);
                  auVar98 = vshufps_avx(auVar90,auVar90,0xc9);
                  auVar97 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                  auVar160._0_4_ = auVar91._0_4_ * auVar90._0_4_;
                  auVar160._4_4_ = auVar91._4_4_ * auVar90._4_4_;
                  auVar160._8_4_ = auVar91._8_4_ * auVar90._8_4_;
                  auVar160._12_4_ = auVar91._12_4_ * auVar90._12_4_;
                  auVar98 = vfmsub231ps_fma(auVar160,auVar98,auVar97);
                  uVar174 = auVar98._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar227;
                    uVar3 = vextractps_avx(auVar98,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar98,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar174;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar230;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar82;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar225._8_4_ = 1;
                  auVar225._0_8_ = 0x100000001;
                  auVar225._12_4_ = 1;
                  auVar225._16_4_ = 1;
                  auVar225._20_4_ = 1;
                  auVar225._24_4_ = 1;
                  auVar225._28_4_ = 1;
                  local_480 = vpermps_avx2(auVar225,ZEXT1632(auVar88));
                  auVar108 = vpermps_avx2(auVar225,ZEXT1632(auVar98));
                  auVar239._8_4_ = 2;
                  auVar239._0_8_ = 0x200000002;
                  auVar239._12_4_ = 2;
                  auVar239._16_4_ = 2;
                  auVar239._20_4_ = 2;
                  auVar239._24_4_ = 2;
                  auVar239._28_4_ = 2;
                  local_4c0 = vpermps_avx2(auVar239,ZEXT1632(auVar98));
                  local_4e0[0] = (RTCHitN)auVar108[0];
                  local_4e0[1] = (RTCHitN)auVar108[1];
                  local_4e0[2] = (RTCHitN)auVar108[2];
                  local_4e0[3] = (RTCHitN)auVar108[3];
                  local_4e0[4] = (RTCHitN)auVar108[4];
                  local_4e0[5] = (RTCHitN)auVar108[5];
                  local_4e0[6] = (RTCHitN)auVar108[6];
                  local_4e0[7] = (RTCHitN)auVar108[7];
                  local_4e0[8] = (RTCHitN)auVar108[8];
                  local_4e0[9] = (RTCHitN)auVar108[9];
                  local_4e0[10] = (RTCHitN)auVar108[10];
                  local_4e0[0xb] = (RTCHitN)auVar108[0xb];
                  local_4e0[0xc] = (RTCHitN)auVar108[0xc];
                  local_4e0[0xd] = (RTCHitN)auVar108[0xd];
                  local_4e0[0xe] = (RTCHitN)auVar108[0xe];
                  local_4e0[0xf] = (RTCHitN)auVar108[0xf];
                  local_4e0[0x10] = (RTCHitN)auVar108[0x10];
                  local_4e0[0x11] = (RTCHitN)auVar108[0x11];
                  local_4e0[0x12] = (RTCHitN)auVar108[0x12];
                  local_4e0[0x13] = (RTCHitN)auVar108[0x13];
                  local_4e0[0x14] = (RTCHitN)auVar108[0x14];
                  local_4e0[0x15] = (RTCHitN)auVar108[0x15];
                  local_4e0[0x16] = (RTCHitN)auVar108[0x16];
                  local_4e0[0x17] = (RTCHitN)auVar108[0x17];
                  local_4e0[0x18] = (RTCHitN)auVar108[0x18];
                  local_4e0[0x19] = (RTCHitN)auVar108[0x19];
                  local_4e0[0x1a] = (RTCHitN)auVar108[0x1a];
                  local_4e0[0x1b] = (RTCHitN)auVar108[0x1b];
                  local_4e0[0x1c] = (RTCHitN)auVar108[0x1c];
                  local_4e0[0x1d] = (RTCHitN)auVar108[0x1d];
                  local_4e0[0x1e] = (RTCHitN)auVar108[0x1e];
                  local_4e0[0x1f] = (RTCHitN)auVar108[0x1f];
                  local_4a0 = uVar174;
                  uStack_49c = uVar174;
                  uStack_498 = uVar174;
                  uStack_494 = uVar174;
                  uStack_490 = uVar174;
                  uStack_48c = uVar174;
                  uStack_488 = uVar174;
                  uStack_484 = uVar174;
                  local_460 = ZEXT432(0) << 0x20;
                  local_440 = local_520._0_8_;
                  uStack_438 = local_520._8_8_;
                  uStack_430 = local_520._16_8_;
                  uStack_428 = local_520._24_8_;
                  local_420 = local_500;
                  auVar108 = vpcmpeqd_avx2(local_500,local_500);
                  local_848[1] = auVar108;
                  *local_848 = auVar108;
                  local_400 = pRVar6->instID[0];
                  uStack_3fc = local_400;
                  uStack_3f8 = local_400;
                  uStack_3f4 = local_400;
                  uStack_3f0 = local_400;
                  uStack_3ec = local_400;
                  uStack_3e8 = local_400;
                  uStack_3e4 = local_400;
                  local_3e0 = pRVar6->instPrimID[0];
                  uStack_3dc = local_3e0;
                  uStack_3d8 = local_3e0;
                  uStack_3d4 = local_3e0;
                  uStack_3d0 = local_3e0;
                  uStack_3cc = local_3e0;
                  uStack_3c8 = local_3e0;
                  uStack_3c4 = local_3e0;
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  local_740 = local_560;
                  local_950.valid = (int *)local_740;
                  local_950.geometryUserPtr = pGVar4->userPtr;
                  local_950.context = context->user;
                  local_950.hit = local_4e0;
                  local_950.N = 8;
                  local_950.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar258 = ZEXT1664(auVar255);
                    auVar264 = ZEXT1664(auVar261);
                    auVar268 = ZEXT1664(auVar89);
                    auVar270 = ZEXT1664(auVar158);
                    (*pGVar4->intersectionFilterN)(&local_950);
                    auVar279 = ZEXT3264(local_920);
                    auVar278 = ZEXT3264(local_900);
                    auVar277 = ZEXT3264(local_8e0);
                    auVar276 = ZEXT3264(local_8c0);
                  }
                  if (local_740 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar264 = ZEXT1664(auVar264._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      (*p_Var5)(&local_950);
                      auVar279 = ZEXT3264(local_920);
                      auVar278 = ZEXT3264(local_900);
                      auVar277 = ZEXT3264(local_8e0);
                      auVar276 = ZEXT3264(local_8c0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      uVar85 = vptestmd_avx512vl(local_740,local_740);
                      iVar64 = *(int *)(local_950.hit + 4);
                      iVar65 = *(int *)(local_950.hit + 8);
                      iVar66 = *(int *)(local_950.hit + 0xc);
                      iVar67 = *(int *)(local_950.hit + 0x10);
                      iVar68 = *(int *)(local_950.hit + 0x14);
                      iVar69 = *(int *)(local_950.hit + 0x18);
                      iVar70 = *(int *)(local_950.hit + 0x1c);
                      bVar76 = (byte)uVar85;
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x180) =
                           (uint)(bVar76 & 1) * *(int *)local_950.hit |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_950.ray + 0x180);
                      *(uint *)(local_950.ray + 0x184) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x184);
                      *(uint *)(local_950.ray + 0x188) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x188);
                      *(uint *)(local_950.ray + 0x18c) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x18c);
                      *(uint *)(local_950.ray + 400) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 400);
                      *(uint *)(local_950.ray + 0x194) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x194);
                      *(uint *)(local_950.ray + 0x198) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x198);
                      *(uint *)(local_950.ray + 0x19c) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x19c);
                      iVar64 = *(int *)(local_950.hit + 0x24);
                      iVar65 = *(int *)(local_950.hit + 0x28);
                      iVar66 = *(int *)(local_950.hit + 0x2c);
                      iVar67 = *(int *)(local_950.hit + 0x30);
                      iVar68 = *(int *)(local_950.hit + 0x34);
                      iVar69 = *(int *)(local_950.hit + 0x38);
                      iVar70 = *(int *)(local_950.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x1a0) =
                           (uint)(bVar76 & 1) * *(int *)(local_950.hit + 0x20) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_950.ray + 0x1a0);
                      *(uint *)(local_950.ray + 0x1a4) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x1a4);
                      *(uint *)(local_950.ray + 0x1a8) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x1a8);
                      *(uint *)(local_950.ray + 0x1ac) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x1ac);
                      *(uint *)(local_950.ray + 0x1b0) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1b0);
                      *(uint *)(local_950.ray + 0x1b4) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1b4);
                      *(uint *)(local_950.ray + 0x1b8) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1b8);
                      *(uint *)(local_950.ray + 0x1bc) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1bc);
                      iVar64 = *(int *)(local_950.hit + 0x44);
                      iVar65 = *(int *)(local_950.hit + 0x48);
                      iVar66 = *(int *)(local_950.hit + 0x4c);
                      iVar67 = *(int *)(local_950.hit + 0x50);
                      iVar68 = *(int *)(local_950.hit + 0x54);
                      iVar69 = *(int *)(local_950.hit + 0x58);
                      iVar70 = *(int *)(local_950.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x1c0) =
                           (uint)(bVar76 & 1) * *(int *)(local_950.hit + 0x40) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_950.ray + 0x1c0);
                      *(uint *)(local_950.ray + 0x1c4) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x1c4);
                      *(uint *)(local_950.ray + 0x1c8) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x1c8);
                      *(uint *)(local_950.ray + 0x1cc) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x1cc);
                      *(uint *)(local_950.ray + 0x1d0) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1d0);
                      *(uint *)(local_950.ray + 0x1d4) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1d4);
                      *(uint *)(local_950.ray + 0x1d8) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1d8);
                      *(uint *)(local_950.ray + 0x1dc) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1dc);
                      iVar64 = *(int *)(local_950.hit + 100);
                      iVar65 = *(int *)(local_950.hit + 0x68);
                      iVar66 = *(int *)(local_950.hit + 0x6c);
                      iVar67 = *(int *)(local_950.hit + 0x70);
                      iVar68 = *(int *)(local_950.hit + 0x74);
                      iVar69 = *(int *)(local_950.hit + 0x78);
                      iVar70 = *(int *)(local_950.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x1e0) =
                           (uint)(bVar76 & 1) * *(int *)(local_950.hit + 0x60) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_950.ray + 0x1e0);
                      *(uint *)(local_950.ray + 0x1e4) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x1e4);
                      *(uint *)(local_950.ray + 0x1e8) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x1e8);
                      *(uint *)(local_950.ray + 0x1ec) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x1ec);
                      *(uint *)(local_950.ray + 0x1f0) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1f0);
                      *(uint *)(local_950.ray + 500) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 500);
                      *(uint *)(local_950.ray + 0x1f8) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1f8);
                      *(uint *)(local_950.ray + 0x1fc) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1fc);
                      iVar64 = *(int *)(local_950.hit + 0x84);
                      iVar65 = *(int *)(local_950.hit + 0x88);
                      iVar66 = *(int *)(local_950.hit + 0x8c);
                      iVar67 = *(int *)(local_950.hit + 0x90);
                      iVar68 = *(int *)(local_950.hit + 0x94);
                      iVar69 = *(int *)(local_950.hit + 0x98);
                      iVar70 = *(int *)(local_950.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x200) =
                           (uint)(bVar76 & 1) * *(int *)(local_950.hit + 0x80) |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_950.ray + 0x200);
                      *(uint *)(local_950.ray + 0x204) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x204);
                      *(uint *)(local_950.ray + 0x208) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x208);
                      *(uint *)(local_950.ray + 0x20c) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x20c);
                      *(uint *)(local_950.ray + 0x210) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x210);
                      *(uint *)(local_950.ray + 0x214) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x214);
                      *(uint *)(local_950.ray + 0x218) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x218);
                      *(uint *)(local_950.ray + 0x21c) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x21c);
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xa0));
                      *(undefined1 (*) [32])(local_950.ray + 0x220) = auVar108;
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xc0));
                      *(undefined1 (*) [32])(local_950.ray + 0x240) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xe0));
                      *(undefined1 (*) [32])(local_950.ray + 0x260) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0x100));
                      *(undefined1 (*) [32])(local_950.ray + 0x280) = auVar108;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar228;
                  break;
                }
              }
              lVar83 = lVar83 + -1;
            } while (lVar83 != 0);
            uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar172._4_4_ = uVar174;
            auVar172._0_4_ = uVar174;
            auVar172._8_4_ = uVar174;
            auVar172._12_4_ = uVar174;
            auVar172._16_4_ = uVar174;
            auVar172._20_4_ = uVar174;
            auVar172._24_4_ = uVar174;
            auVar172._28_4_ = uVar174;
            auVar71._4_4_ = fStack_59c;
            auVar71._0_4_ = local_5a0;
            auVar71._8_4_ = fStack_598;
            auVar71._12_4_ = fStack_594;
            auVar71._16_4_ = fStack_590;
            auVar71._20_4_ = fStack_58c;
            auVar71._24_4_ = fStack_588;
            auVar71._28_4_ = fStack_584;
            uVar17 = vcmpps_avx512vl(auVar172,auVar71,0xd);
            bVar84 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar84 & (byte)uVar17;
          } while (bVar84 != 0);
          auVar111 = local_380;
        }
        bVar77 = local_5c0[0] | ~bVar77;
        auVar189._0_4_ = (float)local_800._0_4_ + auVar111._0_4_;
        auVar189._4_4_ = (float)local_800._4_4_ + auVar111._4_4_;
        auVar189._8_4_ = fStack_7f8 + auVar111._8_4_;
        auVar189._12_4_ = fStack_7f4 + auVar111._12_4_;
        auVar189._16_4_ = fStack_7f0 + auVar111._16_4_;
        auVar189._20_4_ = fStack_7ec + auVar111._20_4_;
        auVar189._24_4_ = fStack_7e8 + auVar111._24_4_;
        auVar189._28_4_ = fStack_7e4 + auVar111._28_4_;
        uVar17 = vcmpps_avx512vl(auVar189,auVar172,2);
        bVar74 = (byte)uVar18 & bVar74 & (byte)uVar17;
        auVar190._8_4_ = 2;
        auVar190._0_8_ = 0x200000002;
        auVar190._12_4_ = 2;
        auVar190._16_4_ = 2;
        auVar190._20_4_ = 2;
        auVar190._24_4_ = 2;
        auVar190._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar108 = vpblendmd_avx512vl(auVar190,auVar33);
        auVar145._0_4_ = (uint)(bVar77 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
        bVar7 = (bool)(bVar77 >> 1 & 1);
        auVar145._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar77 >> 2 & 1);
        auVar145._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar77 >> 3 & 1);
        auVar145._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar77 >> 4 & 1);
        auVar145._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar77 >> 5 & 1);
        auVar145._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar77 >> 6 & 1);
        auVar145._24_4_ = (uint)bVar7 * auVar108._24_4_ | (uint)!bVar7 * 2;
        auVar145._28_4_ = (uint)(bVar77 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
        uVar17 = vpcmpd_avx512vl(local_540,auVar145,5);
        bVar77 = (byte)uVar17 & bVar74;
        fVar209 = (float)local_800._0_4_;
        fVar227 = (float)local_800._4_4_;
        fVar228 = fStack_7f8;
        fVar229 = fStack_7f4;
        fVar230 = fStack_7f0;
        fVar231 = fStack_7ec;
        fVar232 = fStack_7e8;
        fVar208 = fStack_7e4;
        if (bVar77 != 0) {
          auVar98 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar88 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar97 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar89 = vminps_avx(auVar98,auVar97);
          auVar98 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar97 = vmaxps_avx(auVar88,auVar98);
          auVar198._8_4_ = 0x7fffffff;
          auVar198._0_8_ = 0x7fffffff7fffffff;
          auVar198._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar89,auVar198);
          auVar98 = vandps_avx(auVar97,auVar198);
          auVar88 = vmaxps_avx(auVar88,auVar98);
          auVar98 = vmovshdup_avx(auVar88);
          auVar98 = vmaxss_avx(auVar98,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar98);
          fVar209 = auVar88._0_4_ * 1.9073486e-06;
          local_700 = vshufps_avx(auVar97,auVar97,0xff);
          local_5a0 = (float)local_800._0_4_ + local_3c0._0_4_;
          fStack_59c = (float)local_800._4_4_ + local_3c0._4_4_;
          fStack_598 = fStack_7f8 + local_3c0._8_4_;
          fStack_594 = fStack_7f4 + local_3c0._12_4_;
          fStack_590 = fStack_7f0 + local_3c0._16_4_;
          fStack_58c = fStack_7ec + local_3c0._20_4_;
          fStack_588 = fStack_7e8 + local_3c0._24_4_;
          fStack_584 = fStack_7e4 + local_3c0._28_4_;
          _local_6c0 = local_3c0;
          local_5c0 = auVar145;
          do {
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar108 = vblendmps_avx512vl(auVar173,_local_6c0);
            auVar146._0_4_ =
                 (uint)(bVar77 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar77 >> 1 & 1);
            auVar146._4_4_ = (uint)bVar7 * auVar108._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar77 >> 2 & 1);
            auVar146._8_4_ = (uint)bVar7 * auVar108._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar77 >> 3 & 1);
            auVar146._12_4_ = (uint)bVar7 * auVar108._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar77 >> 4 & 1);
            auVar146._16_4_ = (uint)bVar7 * auVar108._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar77 >> 5 & 1);
            auVar146._20_4_ = (uint)bVar7 * auVar108._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar146._24_4_ =
                 (uint)(bVar77 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar108 = vshufps_avx(auVar146,auVar146,0xb1);
            auVar108 = vminps_avx(auVar146,auVar108);
            auVar110 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar110);
            auVar110 = vpermpd_avx2(auVar108,0x4e);
            auVar108 = vminps_avx(auVar108,auVar110);
            uVar17 = vcmpps_avx512vl(auVar146,auVar108,0);
            bVar76 = (byte)uVar17 & bVar77;
            bVar84 = bVar77;
            if (bVar76 != 0) {
              bVar84 = bVar76;
            }
            iVar20 = 0;
            for (uVar87 = (uint)bVar84; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar87 = *(uint *)(local_1c0 + (uint)(iVar20 << 2));
            uVar86 = *(uint *)(local_3a0 + (uint)(iVar20 << 2));
            fVar227 = auVar15._0_4_;
            if ((float)local_820._0_4_ < 0.0) {
              fVar227 = sqrtf((float)local_820._0_4_);
            }
            auVar88 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar87),0x10);
            lVar83 = 5;
            do {
              uVar174 = auVar88._0_4_;
              auVar161._4_4_ = uVar174;
              auVar161._0_4_ = uVar174;
              auVar161._8_4_ = uVar174;
              auVar161._12_4_ = uVar174;
              auVar98 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_810);
              auVar97 = vmovshdup_avx(auVar88);
              fVar233 = auVar97._0_4_;
              fVar208 = 1.0 - fVar233;
              fVar228 = fVar233 * fVar233;
              auVar260 = SUB6416(ZEXT464(0x40400000),0);
              auVar92 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar90 = vfmadd213ss_fma(auVar260,auVar97,auVar92);
              auVar89 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar228),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar91 = vfmadd213ss_fma(auVar260,ZEXT416((uint)fVar208),auVar92);
              auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar208 * fVar208)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar229 = fVar208 * fVar208 * -fVar233 * 0.5;
              fVar230 = auVar89._0_4_ * 0.5;
              fVar231 = auVar91._0_4_ * 0.5;
              fVar232 = fVar233 * fVar233 * -fVar208 * 0.5;
              auVar217._0_4_ = fVar232 * (float)local_7e0._0_4_;
              auVar217._4_4_ = fVar232 * (float)local_7e0._4_4_;
              auVar217._8_4_ = fVar232 * fStack_7d8;
              auVar217._12_4_ = fVar232 * fStack_7d4;
              auVar235._4_4_ = fVar231;
              auVar235._0_4_ = fVar231;
              auVar235._8_4_ = fVar231;
              auVar235._12_4_ = fVar231;
              auVar89 = vfmadd132ps_fma(auVar235,auVar217,local_7a0._0_16_);
              auVar199._4_4_ = fVar230;
              auVar199._0_4_ = fVar230;
              auVar199._8_4_ = fVar230;
              auVar199._12_4_ = fVar230;
              auVar89 = vfmadd132ps_fma(auVar199,auVar89,local_7c0._0_16_);
              auVar218._4_4_ = fVar229;
              auVar218._0_4_ = fVar229;
              auVar218._8_4_ = fVar229;
              auVar218._12_4_ = fVar229;
              auVar89 = vfmadd132ps_fma(auVar218,auVar89,local_780._0_16_);
              auVar91 = vfmadd231ss_fma(auVar92,auVar97,ZEXT416(0x41100000));
              local_660._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar97,ZEXT416(0x40800000));
              local_680._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(auVar260,auVar97,ZEXT416(0xbf800000));
              local_6a0._0_16_ = auVar91;
              _local_640 = auVar89;
              auVar89 = vsubps_avx(auVar98,auVar89);
              auVar98 = vdpps_avx(auVar89,auVar89,0x7f);
              fVar229 = auVar98._0_4_;
              local_760 = ZEXT1632(auVar88);
              if (fVar229 < 0.0) {
                local_880._0_4_ = auVar90._0_4_;
                local_8a0._0_16_ = ZEXT416((uint)fVar208);
                local_840._0_4_ = fVar228;
                auVar268._0_4_ = sqrtf(fVar229);
                auVar268._4_60_ = extraout_var_00;
                auVar90 = ZEXT416((uint)local_880._0_4_);
                auVar88 = auVar268._0_16_;
                auVar91 = local_8a0._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar98,auVar98);
                local_840._0_4_ = fVar228;
                auVar91 = ZEXT416((uint)fVar208);
              }
              fVar228 = auVar91._0_4_;
              auVar260 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar228 + fVar228))),auVar91,
                                          auVar91);
              auVar90 = vfmadd213ss_fma(auVar90,ZEXT416((uint)(fVar233 + fVar233)),
                                        ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar97,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * fVar228 * -3.0)),
                                        ZEXT416((uint)(fVar228 + fVar228)),auVar91);
              auVar91 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 * -2.0)),auVar97,
                                        ZEXT416((uint)local_840._0_4_));
              fVar228 = auVar260._0_4_ * 0.5;
              fVar230 = auVar90._0_4_ * 0.5;
              fVar231 = auVar92._0_4_ * 0.5;
              fVar232 = auVar91._0_4_ * 0.5;
              auVar219._0_4_ = fVar232 * (float)local_7e0._0_4_;
              auVar219._4_4_ = fVar232 * (float)local_7e0._4_4_;
              auVar219._8_4_ = fVar232 * fStack_7d8;
              auVar219._12_4_ = fVar232 * fStack_7d4;
              auVar200._4_4_ = fVar231;
              auVar200._0_4_ = fVar231;
              auVar200._8_4_ = fVar231;
              auVar200._12_4_ = fVar231;
              auVar90 = vfmadd132ps_fma(auVar200,auVar219,local_7a0._0_16_);
              auVar181._4_4_ = fVar230;
              auVar181._0_4_ = fVar230;
              auVar181._8_4_ = fVar230;
              auVar181._12_4_ = fVar230;
              auVar90 = vfmadd132ps_fma(auVar181,auVar90,local_7c0._0_16_);
              auVar273._4_4_ = fVar228;
              auVar273._0_4_ = fVar228;
              auVar273._8_4_ = fVar228;
              auVar273._12_4_ = fVar228;
              local_880._0_16_ = vfmadd132ps_fma(auVar273,auVar90,local_780._0_16_);
              local_840._0_16_ = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
              auVar62._12_4_ = 0;
              auVar62._0_12_ = ZEXT812(0);
              fVar228 = local_840._0_4_;
              auVar90 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar228));
              fVar230 = auVar90._0_4_;
              auVar91 = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar228));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(local_840._0_16_,auVar25);
              auVar90 = vfnmadd213ss_fma(auVar91,local_840._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_8a0._0_4_ = auVar88._0_4_;
              if (fVar228 < auVar92._0_4_) {
                fVar231 = sqrtf(fVar228);
                auVar88 = ZEXT416((uint)local_8a0._0_4_);
                auVar92 = local_880._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(local_840._0_16_,local_840._0_16_);
                fVar231 = auVar92._0_4_;
                auVar92 = local_880._0_16_;
              }
              fVar228 = fVar230 * 1.5 + fVar228 * -0.5 * fVar230 * fVar230 * fVar230;
              auVar162._0_4_ = auVar92._0_4_ * fVar228;
              auVar162._4_4_ = auVar92._4_4_ * fVar228;
              auVar162._8_4_ = auVar92._8_4_ * fVar228;
              auVar162._12_4_ = auVar92._12_4_ * fVar228;
              auVar260 = vdpps_avx(auVar89,auVar162,0x7f);
              fVar208 = auVar88._0_4_;
              fVar230 = auVar260._0_4_;
              auVar163._0_4_ = fVar230 * fVar230;
              auVar163._4_4_ = auVar260._4_4_ * auVar260._4_4_;
              auVar163._8_4_ = auVar260._8_4_ * auVar260._8_4_;
              auVar163._12_4_ = auVar260._12_4_ * auVar260._12_4_;
              auVar93 = vsubps_avx512vl(auVar98,auVar163);
              fVar232 = auVar93._0_4_;
              auVar182._4_12_ = ZEXT812(0) << 0x20;
              auVar182._0_4_ = fVar232;
              auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
              auVar95 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
              if (fVar232 < 0.0) {
                local_6f0 = fVar228;
                fStack_6ec = fVar228;
                fStack_6e8 = fVar228;
                fStack_6e4 = fVar228;
                local_6e0 = auVar94;
                fVar232 = sqrtf(fVar232);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar88 = ZEXT416((uint)local_8a0._0_4_);
                auVar93 = local_6e0;
                auVar92 = local_880._0_16_;
                fVar228 = local_6f0;
                fVar233 = fStack_6ec;
                fVar241 = fStack_6e8;
                fVar242 = fStack_6e4;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                fVar232 = auVar93._0_4_;
                auVar93 = auVar94;
                fVar233 = fVar228;
                fVar241 = fVar228;
                fVar242 = fVar228;
              }
              auVar268 = ZEXT1664(auVar89);
              auVar276 = ZEXT3264(local_8c0);
              auVar277 = ZEXT3264(local_8e0);
              auVar278 = ZEXT3264(local_900);
              auVar279 = ZEXT3264(local_920);
              auVar183._0_4_ = (float)local_6a0._0_4_ * (float)local_7e0._0_4_;
              auVar183._4_4_ = (float)local_6a0._0_4_ * (float)local_7e0._4_4_;
              auVar183._8_4_ = (float)local_6a0._0_4_ * fStack_7d8;
              auVar183._12_4_ = (float)local_6a0._0_4_ * fStack_7d4;
              auVar201._4_4_ = local_680._0_4_;
              auVar201._0_4_ = local_680._0_4_;
              auVar201._8_4_ = local_680._0_4_;
              auVar201._12_4_ = local_680._0_4_;
              auVar271 = vfmadd132ps_fma(auVar201,auVar183,local_7a0._0_16_);
              auVar184._4_4_ = local_660._0_4_;
              auVar184._0_4_ = local_660._0_4_;
              auVar184._8_4_ = local_660._0_4_;
              auVar184._12_4_ = local_660._0_4_;
              auVar271 = vfmadd132ps_fma(auVar184,auVar271,local_7c0._0_16_);
              auVar97 = vfmadd213ss_fma(auVar97,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar174 = auVar97._0_4_;
              auVar202._4_4_ = uVar174;
              auVar202._0_4_ = uVar174;
              auVar202._8_4_ = uVar174;
              auVar202._12_4_ = uVar174;
              auVar97 = vfmadd132ps_fma(auVar202,auVar271,local_780._0_16_);
              auVar185._0_4_ = auVar97._0_4_ * (float)local_840._0_4_;
              auVar185._4_4_ = auVar97._4_4_ * (float)local_840._0_4_;
              auVar185._8_4_ = auVar97._8_4_ * (float)local_840._0_4_;
              auVar185._12_4_ = auVar97._12_4_ * (float)local_840._0_4_;
              auVar97 = vdpps_avx(auVar92,auVar97,0x7f);
              fVar243 = auVar97._0_4_;
              auVar203._0_4_ = auVar92._0_4_ * fVar243;
              auVar203._4_4_ = auVar92._4_4_ * fVar243;
              auVar203._8_4_ = auVar92._8_4_ * fVar243;
              auVar203._12_4_ = auVar92._12_4_ * fVar243;
              auVar97 = vsubps_avx(auVar185,auVar203);
              local_ab0 = auVar91._0_4_;
              local_ab0 = auVar90._0_4_ * local_ab0;
              auVar91 = vmaxss_avx(ZEXT416((uint)fVar209),
                                   ZEXT416((uint)(local_760._0_4_ * fVar227 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar147._16_16_ = local_920._16_16_;
              auVar96 = vxorps_avx512vl(auVar92,auVar26);
              auVar204._0_4_ = fVar228 * auVar97._0_4_ * local_ab0;
              auVar204._4_4_ = fVar233 * auVar97._4_4_ * local_ab0;
              auVar204._8_4_ = fVar241 * auVar97._8_4_ * local_ab0;
              auVar204._12_4_ = fVar242 * auVar97._12_4_ * local_ab0;
              auVar270 = ZEXT1664(auVar162);
              auVar97 = vdpps_avx(auVar96,auVar162,0x7f);
              auVar90 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar209),auVar91);
              auVar88 = vdpps_avx(auVar89,auVar204,0x7f);
              auVar271 = vfmadd213ss_fma(ZEXT416((uint)(fVar208 + 1.0)),
                                         ZEXT416((uint)(fVar209 / fVar231)),auVar90);
              fVar228 = auVar97._0_4_ + auVar88._0_4_;
              auVar88 = vdpps_avx(local_810,auVar162,0x7f);
              auVar97 = vdpps_avx(auVar89,auVar96,0x7f);
              auVar90 = vmulss_avx512f(auVar95,auVar93);
              fVar231 = auVar94._0_4_ * 1.5 + auVar90._0_4_ * auVar93._0_4_ * auVar93._0_4_;
              auVar90 = vdpps_avx(auVar89,local_810,0x7f);
              auVar94 = vfnmadd231ss_fma(auVar97,auVar260,ZEXT416((uint)fVar228));
              auVar90 = vfnmadd231ss_fma(auVar90,auVar260,auVar88);
              auVar97 = vpermilps_avx(_local_640,0xff);
              fVar232 = fVar232 - auVar97._0_4_;
              auVar93 = vshufps_avx(auVar92,auVar92,0xff);
              auVar97 = vfmsub213ss_fma(auVar94,ZEXT416((uint)fVar231),auVar93);
              auVar262._8_4_ = 0x80000000;
              auVar262._0_8_ = 0x8000000080000000;
              auVar262._12_4_ = 0x80000000;
              auVar264 = ZEXT1664(auVar262);
              auVar256._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar258 = ZEXT1664(auVar256);
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * fVar231));
              auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar97._0_4_)),
                                        ZEXT416((uint)fVar228),auVar90);
              auVar97 = vinsertps_avx(auVar256,auVar90,0x1c);
              auVar248._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar248._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar248._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar90 = vinsertps_avx(ZEXT416((uint)fVar228),auVar248,0x10);
              auVar220._0_4_ = auVar94._0_4_;
              auVar220._4_4_ = auVar220._0_4_;
              auVar220._8_4_ = auVar220._0_4_;
              auVar220._12_4_ = auVar220._0_4_;
              auVar88 = vdivps_avx(auVar97,auVar220);
              auVar97 = vdivps_avx(auVar90,auVar220);
              auVar221._0_4_ = fVar230 * auVar88._0_4_ + fVar232 * auVar97._0_4_;
              auVar221._4_4_ = fVar230 * auVar88._4_4_ + fVar232 * auVar97._4_4_;
              auVar221._8_4_ = fVar230 * auVar88._8_4_ + fVar232 * auVar97._8_4_;
              auVar221._12_4_ = fVar230 * auVar88._12_4_ + fVar232 * auVar97._12_4_;
              auVar88 = vsubps_avx(local_760._0_16_,auVar221);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar97 = vandps_avx512vl(auVar260,auVar27);
              if (auVar97._0_4_ < auVar271._0_4_) {
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar271._0_4_ + auVar91._0_4_)),local_700,
                                          ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar28);
                if (auVar90._0_4_ < auVar97._0_4_) {
                  fVar227 = auVar88._0_4_ + (float)local_710._0_4_;
                  if ((fVar227 < fVar156) ||
                     (fVar228 = *(float *)(ray + k * 4 + 0x100), fVar228 < fVar227)) break;
                  auVar97 = vmovshdup_avx(auVar88);
                  fVar230 = auVar97._0_4_;
                  if ((fVar230 < 0.0) || (1.0 < fVar230)) break;
                  auVar63._12_4_ = 0;
                  auVar63._0_12_ = ZEXT412(0);
                  auVar147._4_12_ = ZEXT412(0);
                  auVar147._0_4_ = fVar229;
                  auVar97 = vrsqrt14ss_avx512f(auVar63 << 0x20,auVar147._0_16_);
                  fVar229 = auVar97._0_4_;
                  auVar98 = vmulss_avx512f(auVar98,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar82].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar229 = fVar229 * 1.5 + auVar98._0_4_ * fVar229 * fVar229 * fVar229;
                  auVar222._0_4_ = auVar89._0_4_ * fVar229;
                  auVar222._4_4_ = auVar89._4_4_ * fVar229;
                  auVar222._8_4_ = auVar89._8_4_ * fVar229;
                  auVar222._12_4_ = auVar89._12_4_ * fVar229;
                  auVar91 = vfmadd213ps_fma(auVar93,auVar222,auVar92);
                  auVar98 = vshufps_avx(auVar222,auVar222,0xc9);
                  auVar97 = vshufps_avx(auVar92,auVar92,0xc9);
                  auVar223._0_4_ = auVar222._0_4_ * auVar97._0_4_;
                  auVar223._4_4_ = auVar222._4_4_ * auVar97._4_4_;
                  auVar223._8_4_ = auVar222._8_4_ * auVar97._8_4_;
                  auVar223._12_4_ = auVar222._12_4_ * auVar97._12_4_;
                  auVar90 = vfmsub231ps_fma(auVar223,auVar92,auVar98);
                  auVar98 = vshufps_avx(auVar90,auVar90,0xc9);
                  auVar97 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                  auVar164._0_4_ = auVar91._0_4_ * auVar90._0_4_;
                  auVar164._4_4_ = auVar91._4_4_ * auVar90._4_4_;
                  auVar164._8_4_ = auVar91._8_4_ * auVar90._8_4_;
                  auVar164._12_4_ = auVar91._12_4_ * auVar90._12_4_;
                  auVar98 = vfmsub231ps_fma(auVar164,auVar98,auVar97);
                  uVar174 = auVar98._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar227;
                    uVar3 = vextractps_avx(auVar98,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar98,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar174;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar230;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar82;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar226._8_4_ = 1;
                  auVar226._0_8_ = 0x100000001;
                  auVar226._12_4_ = 1;
                  auVar226._16_4_ = 1;
                  auVar226._20_4_ = 1;
                  auVar226._24_4_ = 1;
                  auVar226._28_4_ = 1;
                  local_480 = vpermps_avx2(auVar226,ZEXT1632(auVar88));
                  auVar108 = vpermps_avx2(auVar226,ZEXT1632(auVar98));
                  auVar240._8_4_ = 2;
                  auVar240._0_8_ = 0x200000002;
                  auVar240._12_4_ = 2;
                  auVar240._16_4_ = 2;
                  auVar240._20_4_ = 2;
                  auVar240._24_4_ = 2;
                  auVar240._28_4_ = 2;
                  local_4c0 = vpermps_avx2(auVar240,ZEXT1632(auVar98));
                  local_4e0[0] = (RTCHitN)auVar108[0];
                  local_4e0[1] = (RTCHitN)auVar108[1];
                  local_4e0[2] = (RTCHitN)auVar108[2];
                  local_4e0[3] = (RTCHitN)auVar108[3];
                  local_4e0[4] = (RTCHitN)auVar108[4];
                  local_4e0[5] = (RTCHitN)auVar108[5];
                  local_4e0[6] = (RTCHitN)auVar108[6];
                  local_4e0[7] = (RTCHitN)auVar108[7];
                  local_4e0[8] = (RTCHitN)auVar108[8];
                  local_4e0[9] = (RTCHitN)auVar108[9];
                  local_4e0[10] = (RTCHitN)auVar108[10];
                  local_4e0[0xb] = (RTCHitN)auVar108[0xb];
                  local_4e0[0xc] = (RTCHitN)auVar108[0xc];
                  local_4e0[0xd] = (RTCHitN)auVar108[0xd];
                  local_4e0[0xe] = (RTCHitN)auVar108[0xe];
                  local_4e0[0xf] = (RTCHitN)auVar108[0xf];
                  local_4e0[0x10] = (RTCHitN)auVar108[0x10];
                  local_4e0[0x11] = (RTCHitN)auVar108[0x11];
                  local_4e0[0x12] = (RTCHitN)auVar108[0x12];
                  local_4e0[0x13] = (RTCHitN)auVar108[0x13];
                  local_4e0[0x14] = (RTCHitN)auVar108[0x14];
                  local_4e0[0x15] = (RTCHitN)auVar108[0x15];
                  local_4e0[0x16] = (RTCHitN)auVar108[0x16];
                  local_4e0[0x17] = (RTCHitN)auVar108[0x17];
                  local_4e0[0x18] = (RTCHitN)auVar108[0x18];
                  local_4e0[0x19] = (RTCHitN)auVar108[0x19];
                  local_4e0[0x1a] = (RTCHitN)auVar108[0x1a];
                  local_4e0[0x1b] = (RTCHitN)auVar108[0x1b];
                  local_4e0[0x1c] = (RTCHitN)auVar108[0x1c];
                  local_4e0[0x1d] = (RTCHitN)auVar108[0x1d];
                  local_4e0[0x1e] = (RTCHitN)auVar108[0x1e];
                  local_4e0[0x1f] = (RTCHitN)auVar108[0x1f];
                  local_4a0 = uVar174;
                  uStack_49c = uVar174;
                  uStack_498 = uVar174;
                  uStack_494 = uVar174;
                  uStack_490 = uVar174;
                  uStack_48c = uVar174;
                  uStack_488 = uVar174;
                  uStack_484 = uVar174;
                  local_460 = ZEXT432(0) << 0x20;
                  local_440 = local_520._0_8_;
                  uStack_438 = local_520._8_8_;
                  uStack_430 = local_520._16_8_;
                  uStack_428 = local_520._24_8_;
                  local_420 = local_500;
                  auVar108 = vpcmpeqd_avx2(local_500,local_500);
                  local_848[1] = auVar108;
                  *local_848 = auVar108;
                  local_400 = pRVar6->instID[0];
                  uStack_3fc = local_400;
                  uStack_3f8 = local_400;
                  uStack_3f4 = local_400;
                  uStack_3f0 = local_400;
                  uStack_3ec = local_400;
                  uStack_3e8 = local_400;
                  uStack_3e4 = local_400;
                  local_3e0 = pRVar6->instPrimID[0];
                  uStack_3dc = local_3e0;
                  uStack_3d8 = local_3e0;
                  uStack_3d4 = local_3e0;
                  uStack_3d0 = local_3e0;
                  uStack_3cc = local_3e0;
                  uStack_3c8 = local_3e0;
                  uStack_3c4 = local_3e0;
                  *(float *)(ray + k * 4 + 0x100) = fVar227;
                  local_740 = local_560;
                  local_950.valid = (int *)local_740;
                  local_950.geometryUserPtr = pGVar4->userPtr;
                  local_950.context = context->user;
                  local_950.hit = local_4e0;
                  local_950.N = 8;
                  local_950.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar258 = ZEXT1664(auVar256);
                    auVar264 = ZEXT1664(auVar262);
                    auVar268 = ZEXT1664(auVar89);
                    auVar270 = ZEXT1664(auVar162);
                    (*pGVar4->intersectionFilterN)(&local_950);
                    auVar279 = ZEXT3264(local_920);
                    auVar278 = ZEXT3264(local_900);
                    auVar277 = ZEXT3264(local_8e0);
                    auVar276 = ZEXT3264(local_8c0);
                  }
                  if (local_740 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar264 = ZEXT1664(auVar264._0_16_);
                      auVar268 = ZEXT1664(auVar268._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      (*p_Var5)(&local_950);
                      auVar279 = ZEXT3264(local_920);
                      auVar278 = ZEXT3264(local_900);
                      auVar277 = ZEXT3264(local_8e0);
                      auVar276 = ZEXT3264(local_8c0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      uVar85 = vptestmd_avx512vl(local_740,local_740);
                      iVar64 = *(int *)(local_950.hit + 4);
                      iVar65 = *(int *)(local_950.hit + 8);
                      iVar66 = *(int *)(local_950.hit + 0xc);
                      iVar67 = *(int *)(local_950.hit + 0x10);
                      iVar68 = *(int *)(local_950.hit + 0x14);
                      iVar69 = *(int *)(local_950.hit + 0x18);
                      iVar70 = *(int *)(local_950.hit + 0x1c);
                      bVar84 = (byte)uVar85;
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x180) =
                           (uint)(bVar84 & 1) * *(int *)local_950.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_950.ray + 0x180);
                      *(uint *)(local_950.ray + 0x184) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x184);
                      *(uint *)(local_950.ray + 0x188) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x188);
                      *(uint *)(local_950.ray + 0x18c) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x18c);
                      *(uint *)(local_950.ray + 400) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 400);
                      *(uint *)(local_950.ray + 0x194) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x194);
                      *(uint *)(local_950.ray + 0x198) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x198);
                      *(uint *)(local_950.ray + 0x19c) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x19c);
                      iVar64 = *(int *)(local_950.hit + 0x24);
                      iVar65 = *(int *)(local_950.hit + 0x28);
                      iVar66 = *(int *)(local_950.hit + 0x2c);
                      iVar67 = *(int *)(local_950.hit + 0x30);
                      iVar68 = *(int *)(local_950.hit + 0x34);
                      iVar69 = *(int *)(local_950.hit + 0x38);
                      iVar70 = *(int *)(local_950.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x1a0) =
                           (uint)(bVar84 & 1) * *(int *)(local_950.hit + 0x20) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_950.ray + 0x1a0);
                      *(uint *)(local_950.ray + 0x1a4) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x1a4);
                      *(uint *)(local_950.ray + 0x1a8) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x1a8);
                      *(uint *)(local_950.ray + 0x1ac) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x1ac);
                      *(uint *)(local_950.ray + 0x1b0) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1b0);
                      *(uint *)(local_950.ray + 0x1b4) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1b4);
                      *(uint *)(local_950.ray + 0x1b8) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1b8);
                      *(uint *)(local_950.ray + 0x1bc) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1bc);
                      iVar64 = *(int *)(local_950.hit + 0x44);
                      iVar65 = *(int *)(local_950.hit + 0x48);
                      iVar66 = *(int *)(local_950.hit + 0x4c);
                      iVar67 = *(int *)(local_950.hit + 0x50);
                      iVar68 = *(int *)(local_950.hit + 0x54);
                      iVar69 = *(int *)(local_950.hit + 0x58);
                      iVar70 = *(int *)(local_950.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x1c0) =
                           (uint)(bVar84 & 1) * *(int *)(local_950.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_950.ray + 0x1c0);
                      *(uint *)(local_950.ray + 0x1c4) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x1c4);
                      *(uint *)(local_950.ray + 0x1c8) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x1c8);
                      *(uint *)(local_950.ray + 0x1cc) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x1cc);
                      *(uint *)(local_950.ray + 0x1d0) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1d0);
                      *(uint *)(local_950.ray + 0x1d4) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x1d4);
                      *(uint *)(local_950.ray + 0x1d8) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1d8);
                      *(uint *)(local_950.ray + 0x1dc) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1dc);
                      iVar64 = *(int *)(local_950.hit + 100);
                      iVar65 = *(int *)(local_950.hit + 0x68);
                      iVar66 = *(int *)(local_950.hit + 0x6c);
                      iVar67 = *(int *)(local_950.hit + 0x70);
                      iVar68 = *(int *)(local_950.hit + 0x74);
                      iVar69 = *(int *)(local_950.hit + 0x78);
                      iVar70 = *(int *)(local_950.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x1e0) =
                           (uint)(bVar84 & 1) * *(int *)(local_950.hit + 0x60) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_950.ray + 0x1e0);
                      *(uint *)(local_950.ray + 0x1e4) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x1e4);
                      *(uint *)(local_950.ray + 0x1e8) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x1e8);
                      *(uint *)(local_950.ray + 0x1ec) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x1ec);
                      *(uint *)(local_950.ray + 0x1f0) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x1f0);
                      *(uint *)(local_950.ray + 500) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 500);
                      *(uint *)(local_950.ray + 0x1f8) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x1f8);
                      *(uint *)(local_950.ray + 0x1fc) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x1fc);
                      iVar64 = *(int *)(local_950.hit + 0x84);
                      iVar65 = *(int *)(local_950.hit + 0x88);
                      iVar66 = *(int *)(local_950.hit + 0x8c);
                      iVar67 = *(int *)(local_950.hit + 0x90);
                      iVar68 = *(int *)(local_950.hit + 0x94);
                      iVar69 = *(int *)(local_950.hit + 0x98);
                      iVar70 = *(int *)(local_950.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
                      bVar13 = SUB81(uVar85 >> 7,0);
                      *(uint *)(local_950.ray + 0x200) =
                           (uint)(bVar84 & 1) * *(int *)(local_950.hit + 0x80) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_950.ray + 0x200);
                      *(uint *)(local_950.ray + 0x204) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_950.ray + 0x204);
                      *(uint *)(local_950.ray + 0x208) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_950.ray + 0x208);
                      *(uint *)(local_950.ray + 0x20c) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_950.ray + 0x20c);
                      *(uint *)(local_950.ray + 0x210) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_950.ray + 0x210);
                      *(uint *)(local_950.ray + 0x214) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_950.ray + 0x214);
                      *(uint *)(local_950.ray + 0x218) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_950.ray + 0x218);
                      *(uint *)(local_950.ray + 0x21c) =
                           (uint)bVar13 * iVar70 | (uint)!bVar13 * *(int *)(local_950.ray + 0x21c);
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xa0));
                      *(undefined1 (*) [32])(local_950.ray + 0x220) = auVar108;
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xc0));
                      *(undefined1 (*) [32])(local_950.ray + 0x240) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0xe0));
                      *(undefined1 (*) [32])(local_950.ray + 0x260) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_950.hit + 0x100));
                      *(undefined1 (*) [32])(local_950.ray + 0x280) = auVar108;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar228;
                  break;
                }
              }
              lVar83 = lVar83 + -1;
            } while (lVar83 != 0);
            uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar172._4_4_ = uVar174;
            auVar172._0_4_ = uVar174;
            auVar172._8_4_ = uVar174;
            auVar172._12_4_ = uVar174;
            auVar172._16_4_ = uVar174;
            auVar172._20_4_ = uVar174;
            auVar172._24_4_ = uVar174;
            auVar172._28_4_ = uVar174;
            auVar72._4_4_ = fStack_59c;
            auVar72._0_4_ = local_5a0;
            auVar72._8_4_ = fStack_598;
            auVar72._12_4_ = fStack_594;
            auVar72._16_4_ = fStack_590;
            auVar72._20_4_ = fStack_58c;
            auVar72._24_4_ = fStack_588;
            auVar72._28_4_ = fStack_584;
            uVar17 = vcmpps_avx512vl(auVar172,auVar72,0xd);
            bVar77 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar77 & (byte)uVar17;
          } while (bVar77 != 0);
          auVar145 = local_5c0;
          fVar209 = (float)local_800._0_4_;
          fVar227 = (float)local_800._4_4_;
          fVar228 = fStack_7f8;
          fVar229 = fStack_7f4;
          fVar230 = fStack_7f0;
          fVar231 = fStack_7ec;
          fVar232 = fStack_7e8;
          fVar208 = fStack_7e4;
        }
        uVar18 = vpcmpgtd_avx512vl(auVar145,local_540);
        uVar19 = vpcmpd_avx512vl(local_540,local_360,1);
        auVar206._0_4_ = fVar209 + (float)local_200._0_4_;
        auVar206._4_4_ = fVar227 + (float)local_200._4_4_;
        auVar206._8_4_ = fVar228 + fStack_1f8;
        auVar206._12_4_ = fVar229 + fStack_1f4;
        auVar206._16_4_ = fVar230 + fStack_1f0;
        auVar206._20_4_ = fVar231 + fStack_1ec;
        auVar206._24_4_ = fVar232 + fStack_1e8;
        auVar206._28_4_ = fVar208 + fStack_1e4;
        uVar17 = vcmpps_avx512vl(auVar206,auVar172,2);
        bVar78 = bVar78 & (byte)uVar19 & (byte)uVar17;
        auVar207._0_4_ = fVar209 + local_3c0._0_4_;
        auVar207._4_4_ = fVar227 + local_3c0._4_4_;
        auVar207._8_4_ = fVar228 + local_3c0._8_4_;
        auVar207._12_4_ = fVar229 + local_3c0._12_4_;
        auVar207._16_4_ = fVar230 + local_3c0._16_4_;
        auVar207._20_4_ = fVar231 + local_3c0._20_4_;
        auVar207._24_4_ = fVar232 + local_3c0._24_4_;
        auVar207._28_4_ = fVar208 + local_3c0._28_4_;
        uVar17 = vcmpps_avx512vl(auVar207,auVar172,2);
        bVar74 = bVar74 & (byte)uVar18 & (byte)uVar17 | bVar78;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar280 = ZEXT3264(auVar108);
        prim = local_6d0;
        if (bVar74 != 0) {
          abStack_180[uVar79 * 0x60] = bVar74;
          auVar148._0_4_ =
               (uint)(bVar78 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar78 & 1) * (int)local_3c0._0_4_;
          bVar7 = (bool)(bVar78 >> 1 & 1);
          auVar148._4_4_ = (uint)bVar7 * local_200._4_4_ | (uint)!bVar7 * (int)local_3c0._4_4_;
          bVar7 = (bool)(bVar78 >> 2 & 1);
          auVar148._8_4_ = (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)local_3c0._8_4_;
          bVar7 = (bool)(bVar78 >> 3 & 1);
          auVar148._12_4_ = (uint)bVar7 * (int)fStack_1f4 | (uint)!bVar7 * (int)local_3c0._12_4_;
          bVar7 = (bool)(bVar78 >> 4 & 1);
          auVar148._16_4_ = (uint)bVar7 * (int)fStack_1f0 | (uint)!bVar7 * (int)local_3c0._16_4_;
          bVar7 = (bool)(bVar78 >> 5 & 1);
          auVar148._20_4_ = (uint)bVar7 * (int)fStack_1ec | (uint)!bVar7 * (int)local_3c0._20_4_;
          auVar148._24_4_ =
               (uint)(bVar78 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar78 >> 6) * (int)local_3c0._24_4_;
          auVar148._28_4_ = local_3c0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar148;
          uVar85 = vmovlps_avx(local_570);
          (&uStack_140)[uVar79 * 0xc] = uVar85;
          aiStack_138[uVar79 * 0x18] = iVar80 + 1;
          uVar79 = (ulong)((int)uVar79 + 1);
        }
      }
    }
    do {
      uVar87 = (uint)uVar79;
      uVar79 = (ulong)(uVar87 - 1);
      if (uVar87 == 0) {
        uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar35._4_4_ = uVar174;
        auVar35._0_4_ = uVar174;
        auVar35._8_4_ = uVar174;
        auVar35._12_4_ = uVar174;
        auVar35._16_4_ = uVar174;
        auVar35._20_4_ = uVar174;
        auVar35._24_4_ = uVar174;
        auVar35._28_4_ = uVar174;
        uVar17 = vcmpps_avx512vl(local_340,auVar35,2);
        uVar82 = (uint)local_6c8 & (uint)uVar17;
        local_6c8 = (ulong)uVar82;
        if (uVar82 == 0) {
          return;
        }
        goto LAB_01d142c9;
      }
      lVar83 = uVar79 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar187._0_4_ = fVar209 + auVar108._0_4_;
      auVar187._4_4_ = fVar227 + auVar108._4_4_;
      auVar187._8_4_ = fVar228 + auVar108._8_4_;
      auVar187._12_4_ = fVar229 + auVar108._12_4_;
      auVar187._16_4_ = fVar230 + auVar108._16_4_;
      auVar187._20_4_ = fVar231 + auVar108._20_4_;
      auVar187._24_4_ = fVar232 + auVar108._24_4_;
      auVar187._28_4_ = fVar208 + auVar108._28_4_;
      uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar174;
      auVar34._0_4_ = uVar174;
      auVar34._8_4_ = uVar174;
      auVar34._12_4_ = uVar174;
      auVar34._16_4_ = uVar174;
      auVar34._20_4_ = uVar174;
      auVar34._24_4_ = uVar174;
      auVar34._28_4_ = uVar174;
      uVar17 = vcmpps_avx512vl(auVar187,auVar34,2);
      uVar86 = (uint)uVar17 & (uint)abStack_180[lVar83];
    } while (uVar86 == 0);
    uVar85 = (&uStack_140)[uVar79 * 0xc];
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar85;
    auVar205._8_4_ = 0x7f800000;
    auVar205._0_8_ = 0x7f8000007f800000;
    auVar205._12_4_ = 0x7f800000;
    auVar205._16_4_ = 0x7f800000;
    auVar205._20_4_ = 0x7f800000;
    auVar205._24_4_ = 0x7f800000;
    auVar205._28_4_ = 0x7f800000;
    auVar110 = vblendmps_avx512vl(auVar205,auVar108);
    bVar74 = (byte)uVar86;
    auVar142._0_4_ =
         (uint)(bVar74 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar108._0_4_;
    bVar7 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar142._4_4_ = (uint)bVar7 * auVar110._4_4_ | (uint)!bVar7 * (int)auVar108._4_4_;
    bVar7 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar142._8_4_ = (uint)bVar7 * auVar110._8_4_ | (uint)!bVar7 * (int)auVar108._8_4_;
    bVar7 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar142._12_4_ = (uint)bVar7 * auVar110._12_4_ | (uint)!bVar7 * (int)auVar108._12_4_;
    bVar7 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar142._16_4_ = (uint)bVar7 * auVar110._16_4_ | (uint)!bVar7 * (int)auVar108._16_4_;
    bVar7 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar142._20_4_ = (uint)bVar7 * auVar110._20_4_ | (uint)!bVar7 * (int)auVar108._20_4_;
    bVar7 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar142._24_4_ = (uint)bVar7 * auVar110._24_4_ | (uint)!bVar7 * (int)auVar108._24_4_;
    auVar142._28_4_ =
         (uVar86 >> 7) * auVar110._28_4_ | (uint)!SUB41(uVar86 >> 7,0) * (int)auVar108._28_4_;
    auVar108 = vshufps_avx(auVar142,auVar142,0xb1);
    auVar108 = vminps_avx(auVar142,auVar108);
    auVar110 = vshufpd_avx(auVar108,auVar108,5);
    auVar108 = vminps_avx(auVar108,auVar110);
    auVar110 = vpermpd_avx2(auVar108,0x4e);
    auVar108 = vminps_avx(auVar108,auVar110);
    uVar17 = vcmpps_avx512vl(auVar142,auVar108,0);
    bVar77 = (byte)uVar17 & bVar74;
    if (bVar77 != 0) {
      uVar86 = (uint)bVar77;
    }
    uVar149 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      uVar149 = uVar149 + 1;
    }
    iVar80 = aiStack_138[uVar79 * 0x18];
    bVar74 = ~('\x01' << ((byte)uVar149 & 0x1f)) & bVar74;
    abStack_180[lVar83] = bVar74;
    if (bVar74 == 0) {
      uVar87 = uVar87 - 1;
    }
    uVar174 = (undefined4)uVar85;
    auVar168._4_4_ = uVar174;
    auVar168._0_4_ = uVar174;
    auVar168._8_4_ = uVar174;
    auVar168._12_4_ = uVar174;
    auVar168._16_4_ = uVar174;
    auVar168._20_4_ = uVar174;
    auVar168._24_4_ = uVar174;
    auVar168._28_4_ = uVar174;
    auVar88 = vmovshdup_avx(auVar175);
    auVar88 = vsubps_avx(auVar88,auVar175);
    auVar188._0_4_ = auVar88._0_4_;
    auVar188._4_4_ = auVar188._0_4_;
    auVar188._8_4_ = auVar188._0_4_;
    auVar188._12_4_ = auVar188._0_4_;
    auVar188._16_4_ = auVar188._0_4_;
    auVar188._20_4_ = auVar188._0_4_;
    auVar188._24_4_ = auVar188._0_4_;
    auVar188._28_4_ = auVar188._0_4_;
    auVar88 = vfmadd132ps_fma(auVar188,auVar168,_DAT_01faff20);
    auVar108 = ZEXT1632(auVar88);
    local_4e0[0] = (RTCHitN)auVar108[0];
    local_4e0[1] = (RTCHitN)auVar108[1];
    local_4e0[2] = (RTCHitN)auVar108[2];
    local_4e0[3] = (RTCHitN)auVar108[3];
    local_4e0[4] = (RTCHitN)auVar108[4];
    local_4e0[5] = (RTCHitN)auVar108[5];
    local_4e0[6] = (RTCHitN)auVar108[6];
    local_4e0[7] = (RTCHitN)auVar108[7];
    local_4e0[8] = (RTCHitN)auVar108[8];
    local_4e0[9] = (RTCHitN)auVar108[9];
    local_4e0[10] = (RTCHitN)auVar108[10];
    local_4e0[0xb] = (RTCHitN)auVar108[0xb];
    local_4e0[0xc] = (RTCHitN)auVar108[0xc];
    local_4e0[0xd] = (RTCHitN)auVar108[0xd];
    local_4e0[0xe] = (RTCHitN)auVar108[0xe];
    local_4e0[0xf] = (RTCHitN)auVar108[0xf];
    local_4e0[0x10] = (RTCHitN)auVar108[0x10];
    local_4e0[0x11] = (RTCHitN)auVar108[0x11];
    local_4e0[0x12] = (RTCHitN)auVar108[0x12];
    local_4e0[0x13] = (RTCHitN)auVar108[0x13];
    local_4e0[0x14] = (RTCHitN)auVar108[0x14];
    local_4e0[0x15] = (RTCHitN)auVar108[0x15];
    local_4e0[0x16] = (RTCHitN)auVar108[0x16];
    local_4e0[0x17] = (RTCHitN)auVar108[0x17];
    local_4e0[0x18] = (RTCHitN)auVar108[0x18];
    local_4e0[0x19] = (RTCHitN)auVar108[0x19];
    local_4e0[0x1a] = (RTCHitN)auVar108[0x1a];
    local_4e0[0x1b] = (RTCHitN)auVar108[0x1b];
    local_4e0[0x1c] = (RTCHitN)auVar108[0x1c];
    local_4e0[0x1d] = (RTCHitN)auVar108[0x1d];
    local_4e0[0x1e] = (RTCHitN)auVar108[0x1e];
    local_4e0[0x1f] = (RTCHitN)auVar108[0x1f];
    local_570._8_8_ = 0;
    local_570._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar149 * 4);
    uVar79 = (ulong)uVar87;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }